

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  int iVar15;
  size_t sVar16;
  void *pvVar17;
  size_t sVar18;
  int *piVar19;
  _func_int **pp_Var20;
  Layer *pLVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Allocator *pAVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  void *pvVar34;
  undefined1 (*pauVar35) [16];
  _func_int *p_Var36;
  ulong uVar37;
  _func_int ***ppp_Var38;
  _func_int ***ppp_Var39;
  int i_1;
  uint uVar40;
  int iVar41;
  _func_int ***ppp_Var42;
  pointer piVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  void *pvVar47;
  int iVar48;
  long lVar49;
  int i_2;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  undefined1 (*pauVar54) [16];
  undefined1 (*pauVar55) [32];
  void *pvVar56;
  void *pvVar57;
  long lVar58;
  pointer piVar59;
  int j_1;
  void *pvVar60;
  float *pfVar61;
  int iVar62;
  uint uVar63;
  _func_int ***ppp_Var64;
  ulong uVar65;
  bool bVar66;
  float fVar67;
  undefined8 uVar68;
  undefined8 uVar75;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  __m128 one;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint local_308;
  int local_2e8;
  int local_2a8;
  Mat local_298;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  p_Var36 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var36) != 0)) {
    iVar28 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar28;
  }
  uVar40 = bottom_blob->c;
  uVar65 = bottom_blob->elemsize;
  iVar28 = bottom_blob->elempack;
  iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var36);
  iVar44 = *(int *)(&this->field_0xdc + (long)p_Var36);
  iVar62 = *(int *)(&this->field_0xd8 + (long)p_Var36);
  iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var36);
  local_298.cstep = 0;
  local_298.data = (Allocator *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_298.elempack = 0;
  local_298.h = 0;
  local_298.allocator = (Allocator *)local_298.data;
  local_298.dims = (int)local_298.refcount;
  local_298.w = local_298.refcount._4_4_;
  local_298.d = (int)local_298.refcount;
  local_298.c = local_298.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma +
             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]),bottom_blob,&local_298,opt);
  iVar26 = local_298.w;
  iVar45 = -100;
  local_238 = CONCAT44(local_238._4_4_,(undefined4)local_238);
  local_248 = CONCAT44(local_248._4_4_,(int)local_248);
  if (((Allocator *)local_298.data == (Allocator *)0x0) ||
     (local_238 = CONCAT44(local_238._4_4_,(undefined4)local_238),
     local_248 = CONCAT44(local_248._4_4_,(int)local_248), (long)local_298.c * local_298.cstep == 0)
     ) goto LAB_003ab48b;
  p_Var36 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar41 = (~((iVar41 + -1) * iVar44) + local_298.w) / *(int *)(&this->field_0xe4 + (long)p_Var36);
  iVar44 = iVar41 + 1;
  local_2e8 = (~((iVar62 + -1) * iVar14) + local_298.h) /
              *(int *)(&this->field_0xe8 + (long)p_Var36);
  local_248._0_4_ = local_2e8 + 1;
  uVar63 = *(uint *)(&this->field_0xd0 + (long)p_Var36);
  if (opt->use_packing_layout == true) {
    uVar52 = (ulong)((uVar63 & 3) == 0) * 3 + 1;
    if ((uVar63 & 7) == 0) {
      uVar52 = 8;
    }
  }
  else {
    uVar52 = 1;
  }
  uVar51 = (uint)uVar52;
  local_238 = (uVar65 / (ulong)(long)iVar28) * uVar52;
  Mat::create(top_blob,iVar44,(int)local_248,(int)uVar63 / (int)uVar51,local_238,uVar51,
              opt->blob_allocator);
  sVar18 = local_298.cstep;
  iVar27 = local_298.d;
  iVar48 = local_298.h;
  iVar14 = local_298.w;
  pAVar25 = local_298.allocator;
  iVar62 = local_298.elempack;
  pvVar60 = top_blob->data;
  if ((pvVar60 == (void *)0x0) || (sVar16 = top_blob->cstep, (long)top_blob->c * sVar16 == 0))
  goto LAB_003ab48b;
  iVar29 = iVar28 * uVar40;
  p_Var36 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar45 = *(int *)(&this->field_0xd0 + (long)p_Var36);
  iVar15 = *(int *)(&this->field_0x108 + (long)p_Var36);
  if ((iVar29 == iVar15) && (iVar29 == iVar45)) {
    iVar45 = iVar29;
    if (iVar28 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var36) != 3) ||
         (*(int *)(&this->field_0xd8 + (long)p_Var36) != 3)) goto LAB_003a985a;
      if ((*(int *)(&this->field_0xdc + (long)p_Var36) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var36) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var36) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var36) == 1)))) {
        lVar50 = (long)local_298.w;
        iVar28 = top_blob->w;
        iVar41 = top_blob->h;
        pvVar17 = (this->weight_data_tm).data;
        sVar18 = top_blob->elemsize;
        local_238 = *(ulong *)(&this->field_0x1b0 + (long)p_Var36);
        lVar33 = (long)iVar28;
        local_228._0_8_ = lVar50 * 3;
        local_248 = (long)local_298.w;
        uVar65 = 0;
        uVar40 = local_298.c;
        if (local_298.c < 1) {
          uVar40 = 0;
        }
        lVar49 = (long)(local_298.w + 2) * 4;
        for (; uVar65 != uVar40; uVar65 = uVar65 + 1) {
          if (local_238 == 0) {
            fVar67 = 0.0;
          }
          else {
            fVar67 = *(float *)(local_238 + uVar65 * 4);
          }
          pvVar47 = (void *)(sVar16 * sVar18 * uVar65 + (long)pvVar60);
          lVar46 = uVar65 * 0x24;
          ppp_Var39 = (_func_int ***)
                      ((long)(_func_int ***)local_298.data +
                      local_298.elemsize * local_298.cstep * uVar65);
          piVar43 = (pointer)((long)ppp_Var39 + (long)local_298.w * 4);
          ppp_Var42 = ppp_Var39 + lVar50;
          piVar59 = (pointer)((long)ppp_Var39 + lVar50 * 0xc);
          pvVar34 = pvVar47;
          for (uVar63 = 0; (int)(uVar63 | 1) < iVar41; uVar63 = uVar63 + 2) {
            lVar58 = 0;
            for (iVar44 = iVar28; 0 < iVar44; iVar44 = iVar44 + -1) {
              auVar135._8_8_ = 0;
              auVar135._0_8_ = *(ulong *)((long)ppp_Var39 + lVar58 + 4);
              auVar85 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var39 + lVar58)),auVar135);
              auVar85 = vshufps_avx(auVar85,auVar135,0xd8);
              auVar135 = vinsertps_avx(auVar85,ZEXT416((uint)*(float *)((long)piVar43 + lVar58)),
                                       0x30);
              auVar85 = *(undefined1 (*) [16])((long)pvVar17 + lVar46);
              pfVar61 = (float *)((long)pvVar17 + lVar46 + 0x10);
              auVar117._8_8_ = 0;
              auVar117._0_8_ = *(ulong *)((long)piVar43 + lVar58 + 4);
              auVar80 = vinsertps_avx(auVar117,ZEXT416(*(uint *)((long)ppp_Var42 + lVar58)),0x20);
              auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)((long)ppp_Var42 + lVar58 + 4)),0x30)
              ;
              auVar121._0_4_ = *pfVar61 * auVar80._0_4_;
              auVar121._4_4_ = pfVar61[1] * auVar80._4_4_;
              auVar121._8_4_ = pfVar61[2] * auVar80._8_4_;
              auVar121._12_4_ = pfVar61[3] * auVar80._12_4_;
              auVar80 = vhaddps_avx(auVar121,auVar121);
              auVar76._0_4_ = auVar85._0_4_ * auVar135._0_4_;
              auVar76._4_4_ = auVar85._4_4_ * auVar135._4_4_;
              auVar76._8_4_ = auVar85._8_4_ * auVar135._8_4_;
              auVar76._12_4_ = auVar85._12_4_ * auVar135._12_4_;
              auVar80 = vhaddps_avx(auVar80,auVar80);
              auVar135 = vhaddps_avx(auVar76,auVar76);
              auVar135 = vhaddps_avx(auVar135,auVar135);
              auVar121 = ZEXT416(*(uint *)((long)pvVar17 + lVar46 + 0x20));
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar135._0_4_)),auVar121,
                                        ZEXT416(*(uint *)((long)(ppp_Var42 + 1) + lVar58)));
              auVar80 = vmovlhps_avx(auVar85,auVar117);
              auVar80 = vshufps_avx(auVar80,auVar117,0xd8);
              auVar135 = vinsertps_avx(auVar80,ZEXT416(*(uint *)((long)ppp_Var42 + lVar58)),0x30);
              auVar119._8_8_ = 0;
              auVar119._0_8_ = *(ulong *)((long)ppp_Var42 + lVar58 + 4);
              auVar80 = vmovhps_avx(auVar119,*(undefined8 *)((long)piVar59 + lVar58));
              auVar107._0_4_ = auVar80._0_4_ * *pfVar61;
              auVar107._4_4_ = auVar80._4_4_ * pfVar61[1];
              auVar107._8_4_ = auVar80._8_4_ * pfVar61[2];
              auVar107._12_4_ = auVar80._12_4_ * pfVar61[3];
              auVar80 = vhaddps_avx(auVar107,auVar107);
              auVar80 = vhaddps_avx(auVar80,auVar80);
              auVar90._0_4_ = auVar135._0_4_ * *(float *)((long)piVar43 + lVar58);
              auVar90._4_4_ = auVar135._4_4_ * auVar85._4_4_;
              auVar90._8_4_ = auVar135._8_4_ * auVar85._8_4_;
              auVar90._12_4_ = auVar135._12_4_ * auVar85._12_4_;
              auVar85 = vhaddps_avx(auVar90,auVar90);
              auVar85 = vhaddps_avx(auVar85,auVar85);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar85._0_4_)),auVar121,
                                        ZEXT416(*(uint *)((long)piVar59 + lVar58 + 8)));
              *(float *)((long)pvVar47 + lVar58) = auVar76._0_4_ + fVar67;
              *(float *)((long)pvVar34 + lVar58 + lVar33 * 4) = auVar85._0_4_ + fVar67;
              lVar58 = lVar58 + 4;
            }
            ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar58 + lVar49);
            piVar43 = (pointer)((long)piVar43 + lVar58 + lVar49);
            ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar58 + lVar49);
            piVar59 = (pointer)((long)piVar59 + lVar58 + lVar49);
            pvVar47 = (void *)((long)pvVar47 + lVar58 + lVar33 * 4);
            pvVar34 = (void *)((long)pvVar34 + lVar58 + lVar33 * 4);
          }
          for (; (int)uVar63 < iVar41; uVar63 = uVar63 + 1) {
            lVar58 = 0;
            for (iVar44 = iVar28; 0 < iVar44; iVar44 = iVar44 + -1) {
              auVar77._8_8_ = 0;
              auVar77._0_8_ = *(ulong *)((long)ppp_Var39 + lVar58);
              auVar85 = vinsertps_avx(auVar77,ZEXT416(*(uint *)((long)(ppp_Var39 + 1) + lVar58)),
                                      0x20);
              auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)piVar43 + lVar58)),0x30);
              auVar104._16_8_ = *(undefined8 *)((long)piVar43 + lVar58 + 4);
              auVar104._0_16_ = auVar85;
              auVar104._24_8_ = 0;
              auVar88._16_8_ = *(undefined8 *)((long)ppp_Var42 + lVar58);
              auVar88._0_16_ = auVar85;
              auVar88._24_8_ = 0;
              auVar89 = vshufpd_avx(auVar104,auVar88,2);
              pfVar61 = (float *)((long)pvVar17 + lVar46);
              auVar78._0_4_ = auVar89._0_4_ * *pfVar61;
              auVar78._4_4_ = auVar89._4_4_ * pfVar61[1];
              auVar78._8_4_ = auVar89._8_4_ * pfVar61[2];
              auVar78._12_4_ = auVar89._12_4_ * pfVar61[3];
              auVar8._16_4_ = auVar89._16_4_ * pfVar61[4];
              auVar8._0_16_ = auVar78;
              auVar8._20_4_ = auVar89._20_4_ * pfVar61[5];
              auVar8._24_4_ = auVar89._24_4_ * pfVar61[6];
              auVar8._28_4_ = auVar89._28_4_;
              auVar85 = vhaddps_avx(auVar8._16_16_,auVar78);
              auVar85 = vhaddps_avx(auVar85,auVar85);
              auVar85 = vhaddps_avx(auVar85,auVar85);
              auVar85 = vfmadd231ss_fma(auVar85,ZEXT416(*(uint *)((long)pvVar17 + lVar46 + 0x20)),
                                        ZEXT416(*(uint *)((long)(ppp_Var42 + 1) + lVar58)));
              *(float *)((long)pvVar47 + lVar58) = auVar85._0_4_ + fVar67;
              lVar58 = lVar58 + 4;
            }
            ppp_Var39 = (_func_int ***)((long)(ppp_Var39 + 1) + lVar58);
            piVar43 = (pointer)((long)piVar43 + lVar58 + 8);
            ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 1) + lVar58);
            pvVar47 = (void *)((long)pvVar47 + lVar58);
          }
        }
      }
      else {
        if ((((*(int *)(&this->field_0xdc + (long)p_Var36) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var36) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var36) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var36) != 2)) goto LAB_003a985a;
        iVar28 = top_blob->w;
        pvVar17 = (this->weight_data_tm).data;
        lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
        sVar18 = top_blob->elemsize;
        local_248 = (long)local_298.w * 2;
        uVar52 = 0;
        uVar65 = (ulong)(uint)top_blob->h;
        if (top_blob->h < 1) {
          uVar65 = uVar52;
        }
        uVar32 = (ulong)(uint)local_298.c;
        if (local_298.c < 1) {
          uVar32 = uVar52;
        }
        lVar33 = (long)((local_298.w - iVar28) * 2) * 4;
        for (; uVar52 != uVar32; uVar52 = uVar52 + 1) {
          if (lVar50 == 0) {
            fVar67 = 0.0;
          }
          else {
            fVar67 = *(float *)(lVar50 + uVar52 * 4);
          }
          pfVar61 = (float *)(sVar16 * sVar18 * uVar52 + (long)pvVar60);
          ppp_Var39 = (_func_int ***)
                      ((long)(_func_int ***)local_298.data +
                      local_298.elemsize * local_298.cstep * uVar52);
          piVar43 = (pointer)((long)ppp_Var39 + (long)local_298.w * 4);
          ppp_Var42 = ppp_Var39 + local_298.w;
          for (iVar41 = 0; iVar41 != (int)uVar65; iVar41 = iVar41 + 1) {
            lVar49 = 0;
            for (iVar44 = iVar28; 0 < iVar44; iVar44 = iVar44 + -1) {
              auVar85._8_8_ = 0;
              auVar85._0_8_ = *(ulong *)((long)ppp_Var39 + lVar49);
              auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)(ppp_Var39 + 1) + lVar49)),
                                      0x20);
              auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)piVar43 + lVar49)),0x30);
              auVar105._16_8_ = *(undefined8 *)((long)piVar43 + lVar49 + 4);
              auVar105._0_16_ = auVar85;
              auVar105._24_8_ = 0;
              auVar89._16_8_ = *(undefined8 *)((long)ppp_Var42 + lVar49);
              auVar89._0_16_ = auVar85;
              auVar89._24_8_ = 0;
              auVar89 = vshufpd_avx(auVar105,auVar89,2);
              pfVar2 = (float *)((long)pvVar17 + uVar52 * 0x24);
              auVar80._0_4_ = auVar89._0_4_ * *pfVar2;
              auVar80._4_4_ = auVar89._4_4_ * pfVar2[1];
              auVar80._8_4_ = auVar89._8_4_ * pfVar2[2];
              auVar80._12_4_ = auVar89._12_4_ * pfVar2[3];
              auVar7._16_4_ = auVar89._16_4_ * pfVar2[4];
              auVar7._0_16_ = auVar80;
              auVar7._20_4_ = auVar89._20_4_ * pfVar2[5];
              auVar7._24_4_ = auVar89._24_4_ * pfVar2[6];
              auVar7._28_4_ = auVar89._28_4_;
              auVar85 = vhaddps_avx(auVar7._16_16_,auVar80);
              auVar85 = vhaddps_avx(auVar85,auVar85);
              auVar85 = vhaddps_avx(auVar85,auVar85);
              auVar85 = vfmadd231ss_fma(auVar85,ZEXT416(*(uint *)((long)pvVar17 +
                                                                 uVar52 * 0x24 + 0x20)),
                                        ZEXT416(*(uint *)((long)(ppp_Var42 + 1) + lVar49)));
              *pfVar61 = auVar85._0_4_ + fVar67;
              pfVar61 = pfVar61 + 1;
              lVar49 = lVar49 + 8;
            }
            ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar49 + lVar33);
            piVar43 = (pointer)((long)piVar43 + lVar49 + lVar33);
            ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar49 + lVar33);
          }
        }
      }
LAB_003ab4e0:
      pLVar21 = this->activation;
      if (pLVar21 != (Layer *)0x0) {
        (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
      }
    }
    else {
      if (iVar28 == 4) {
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var36);
        iVar62 = *(int *)(&this->field_0xd8 + (long)p_Var36);
        if (iVar28 == 5) {
          if (iVar62 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var36) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var36) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var36) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var36) == 1)))) {
              uVar40 = top_blob->w;
              iVar28 = top_blob->h;
              lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
              uVar65 = 0;
              uVar63 = uVar40;
              if ((int)uVar40 < 1) {
                uVar63 = 0;
              }
              uVar51 = local_298.c;
              if (local_298.c < 1) {
                uVar51 = 0;
              }
              lVar33 = (long)(int)(uVar40 * 4) * 4;
              lVar49 = (long)(local_298.w * 4 + 0x10) * 4;
              for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar65 != uVar51;
                  uVar65 = uVar65 + 1) {
                if (lVar50 == 0) {
                  auVar85 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar85 = *(undefined1 (*) [16])(lVar50 + uVar65 * 0x10);
                }
                pvVar57 = (void *)(top_blob->cstep * uVar65 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar58 = (long)(this->weight_data_tm).w * uVar65 * (this->weight_data_tm).elemsize;
                pvVar56 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar57);
                ppp_Var39 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar65 * local_298.elemsize);
                lVar46 = (long)local_298.w * local_298.elemsize;
                ppp_Var42 = (_func_int ***)((long)ppp_Var39 + lVar46);
                pvVar60 = (void *)((long)ppp_Var39 + lVar46 * 2);
                pvVar47 = (void *)((long)ppp_Var39 + lVar46 * 3);
                piVar43 = (pointer)((long)ppp_Var39 + lVar46 * 4);
                pvVar34 = (void *)((long)ppp_Var39 + lVar46 * 5);
                for (uVar40 = 0; (int)(uVar40 | 1) < iVar28; uVar40 = uVar40 + 2) {
                  lVar46 = 0;
                  uVar31 = uVar63;
                  while (bVar66 = uVar31 != 0, uVar31 = uVar31 - 1, bVar66) {
                    auVar80 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x10);
                    auVar135 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x20);
                    auVar76 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x30);
                    auVar90 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar46),
                                              *(undefined1 (*) [16])((long)pvVar17 + lVar58),auVar85
                                             );
                    auVar90 = vfmadd231ps_fma(auVar90,auVar80,
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 2) + lVar46)
                                             );
                    auVar90 = vfmadd231ps_fma(auVar90,auVar135,
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar46)
                                             );
                    auVar107 = vfmadd231ps_fma(auVar90,auVar76,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var39 + 6) + lVar46));
                    auVar90 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x40);
                    auVar117 = vfmadd231ps_fma(auVar107,auVar90,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var39 + 8) + lVar46));
                    auVar107 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar58),
                                               *(undefined1 (*) [16])((long)ppp_Var42 + lVar46),
                                               auVar85);
                    auVar80 = vfmadd231ps_fma(auVar107,*(undefined1 (*) [16])
                                                        ((long)(ppp_Var42 + 2) + lVar46),auVar80);
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var42 + 4) + lVar46),auVar135);
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var42 + 6) + lVar46),auVar76);
                    auVar78 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var42 + 8) + lVar46),auVar90);
                    auVar80 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x50);
                    auVar135 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x60);
                    auVar76 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x70);
                    auVar90 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x80);
                    auVar107 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x90);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar80,
                                               *(undefined1 (*) [16])((long)ppp_Var42 + lVar46));
                    auVar117 = vfmadd231ps_fma(auVar117,auVar135,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var42 + 2) + lVar46));
                    auVar117 = vfmadd231ps_fma(auVar117,auVar76,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var42 + 4) + lVar46));
                    auVar117 = vfmadd231ps_fma(auVar117,auVar90,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var42 + 6) + lVar46));
                    auVar106 = vfmadd231ps_fma(auVar117,auVar107,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var42 + 8) + lVar46));
                    auVar117 = *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x10);
                    auVar119 = *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x20);
                    auVar121 = *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x30);
                    auVar77 = *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x40);
                    auVar80 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])((long)pvVar60 + lVar46)
                                              ,auVar80);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar117,auVar135);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar119,auVar76);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar121,auVar90);
                    auVar78 = vfmadd231ps_fma(auVar80,auVar77,auVar107);
                    auVar80 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xa0);
                    auVar135 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xb0);
                    auVar76 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xc0);
                    auVar90 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xd0);
                    auVar107 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xe0);
                    auVar106 = vfmadd231ps_fma(auVar106,auVar80,
                                               *(undefined1 (*) [16])((long)pvVar60 + lVar46));
                    auVar117 = vfmadd231ps_fma(auVar106,auVar135,auVar117);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar76,auVar119);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar90,auVar121);
                    auVar106 = vfmadd231ps_fma(auVar117,auVar107,auVar77);
                    auVar117 = *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x10);
                    auVar119 = *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x20);
                    auVar121 = *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x30);
                    auVar77 = *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x40);
                    auVar80 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])((long)pvVar47 + lVar46)
                                              ,auVar80);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar117,auVar135);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar119,auVar76);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar121,auVar90);
                    auVar78 = vfmadd231ps_fma(auVar80,auVar77,auVar107);
                    auVar80 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xf0);
                    auVar135 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x100);
                    auVar76 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x110);
                    auVar90 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x120);
                    auVar107 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x130);
                    auVar106 = vfmadd231ps_fma(auVar106,auVar80,
                                               *(undefined1 (*) [16])((long)pvVar47 + lVar46));
                    auVar117 = vfmadd231ps_fma(auVar106,auVar135,auVar117);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar76,auVar119);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar90,auVar121);
                    auVar106 = vfmadd231ps_fma(auVar117,auVar107,auVar77);
                    auVar117 = *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x10);
                    auVar119 = *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x20);
                    auVar121 = *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x30);
                    auVar77 = *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x40);
                    auVar80 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])((long)piVar43 + lVar46)
                                              ,auVar80);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar117,auVar135);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar119,auVar76);
                    auVar80 = vfmadd231ps_fma(auVar80,auVar121,auVar90);
                    auVar78 = vfmadd231ps_fma(auVar80,auVar77,auVar107);
                    auVar80 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x140);
                    auVar135 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x150);
                    auVar76 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x160);
                    auVar90 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x170);
                    auVar107 = *(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x180);
                    auVar106 = vfmadd231ps_fma(auVar106,auVar80,
                                               *(undefined1 (*) [16])((long)piVar43 + lVar46));
                    auVar117 = vfmadd231ps_fma(auVar106,auVar135,auVar117);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar76,auVar119);
                    auVar117 = vfmadd231ps_fma(auVar117,auVar90,auVar121);
                    auVar80 = vfmadd231ps_fma(auVar78,auVar80,
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar46));
                    auVar80 = vfmadd231ps_fma(auVar80,auVar135,
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar46 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,auVar76,
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar46 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,auVar90,
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar46 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,auVar107,
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar46 + 0x40))
                    ;
                    auVar135 = vfmadd231ps_fma(auVar117,auVar107,auVar77);
                    *(undefined1 (*) [16])((long)pvVar57 + lVar46) = auVar135;
                    *(undefined1 (*) [16])((long)pvVar56 + lVar46) = auVar80;
                    lVar46 = lVar46 + 0x10;
                  }
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar46 + lVar49);
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar46 + lVar49);
                  pvVar60 = (void *)((long)pvVar60 + lVar46 + lVar49);
                  pvVar47 = (void *)((long)pvVar47 + lVar46 + lVar49);
                  piVar43 = (pointer)((long)piVar43 + lVar46 + lVar49);
                  pvVar34 = (void *)((long)pvVar34 + lVar46 + lVar49);
                  pvVar57 = (void *)((long)pvVar57 + lVar46 + lVar33);
                  pvVar56 = (void *)((long)pvVar56 + lVar46 + lVar33);
                }
                for (; (int)uVar40 < iVar28; uVar40 = uVar40 + 1) {
                  lVar46 = 0;
                  uVar31 = uVar63;
                  while (bVar66 = uVar31 != 0, uVar31 = uVar31 - 1, bVar66) {
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar58),auVar85
                                              ,*(undefined1 (*) [16])((long)ppp_Var39 + lVar46));
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x10),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 2) + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x20),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x30),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 6) + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x40),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 8) + lVar46)
                                             );
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x50),
                                              auVar80,*(undefined1 (*) [16])
                                                       ((long)ppp_Var42 + lVar46));
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x60),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x70),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x80),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x90),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar46)
                                             );
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xa0),
                                              auVar80,*(undefined1 (*) [16])((long)pvVar60 + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0xb0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0xc0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0xd0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0xe0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar46 + 0x40))
                    ;
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0xf0),
                                              auVar80,*(undefined1 (*) [16])((long)pvVar47 + lVar46)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x100),
                                              *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x110),
                                              *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x120),
                                              *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x130),
                                              *(undefined1 (*) [16])((long)pvVar47 + lVar46 + 0x40))
                    ;
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar58 + 0x140)
                                              ,auVar80,*(undefined1 (*) [16])
                                                        ((long)piVar43 + lVar46));
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x150),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x160),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x170),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar58 + 0x180),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar46 + 0x40))
                    ;
                    *(undefined1 (*) [16])((long)pvVar57 + lVar46) = auVar80;
                    lVar46 = lVar46 + 0x10;
                  }
                  ppp_Var39 = (_func_int ***)((long)(ppp_Var39 + 8) + lVar46);
                  ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 8) + lVar46);
                  pvVar60 = (void *)((long)pvVar60 + lVar46 + 0x40);
                  pvVar47 = (void *)((long)pvVar47 + lVar46 + 0x40);
                  piVar43 = (pointer)((long)piVar43 + lVar46 + 0x40);
                  pvVar57 = (void *)((long)pvVar57 + lVar46);
                }
              }
            }
            else {
              iVar62 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var36) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var36) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var36) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var36) != 2)) goto LAB_003aa433;
              iVar28 = top_blob->w;
              iVar41 = local_298.w - iVar28;
              lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
              uVar65 = 0;
              if (iVar28 < 1) {
                iVar28 = 0;
              }
              uVar52 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar52 = uVar65;
              }
              uVar32 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar32 = uVar65;
              }
              lVar33 = (long)(iVar41 * 8) * 4;
              for (; uVar65 != uVar32; uVar65 = uVar65 + 1) {
                if (lVar50 == 0) {
                  auVar85 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar85 = *(undefined1 (*) [16])(lVar50 + uVar65 * 0x10);
                }
                pauVar54 = (undefined1 (*) [16])
                           (top_blob->cstep * uVar65 * top_blob->elemsize + (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar46 = (long)(this->weight_data_tm).w * uVar65 * (this->weight_data_tm).elemsize;
                ppp_Var39 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar65 * local_298.elemsize);
                lVar49 = (long)local_298.w * local_298.elemsize;
                ppp_Var42 = (_func_int ***)((long)ppp_Var39 + lVar49);
                pvVar60 = (void *)((long)ppp_Var39 + lVar49 * 2);
                pvVar34 = (void *)((long)ppp_Var39 + lVar49 * 3);
                piVar43 = (pointer)((long)ppp_Var39 + lVar49 * 4);
                for (iVar41 = 0; iVar41 != (int)uVar52; iVar41 = iVar41 + 1) {
                  lVar49 = 0;
                  iVar44 = iVar28;
                  while (bVar66 = iVar44 != 0, iVar44 = iVar44 + -1, bVar66) {
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar46),auVar85
                                              ,*(undefined1 (*) [16])((long)ppp_Var39 + lVar49));
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x10),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 2) + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x20),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x30),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 6) + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x40),
                                              *(undefined1 (*) [16])((long)(ppp_Var39 + 8) + lVar49)
                                             );
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar46 + 0x50),
                                              auVar80,*(undefined1 (*) [16])
                                                       ((long)ppp_Var42 + lVar49));
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x60),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x70),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x80),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x90),
                                              *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar49)
                                             );
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar46 + 0xa0),
                                              auVar80,*(undefined1 (*) [16])((long)pvVar60 + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0xb0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0xc0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0xd0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0xe0),
                                              *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x40))
                    ;
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar46 + 0xf0),
                                              auVar80,*(undefined1 (*) [16])((long)pvVar34 + lVar49)
                                             );
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x100),
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar49 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x110),
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar49 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x120),
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar49 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x130),
                                              *(undefined1 (*) [16])((long)pvVar34 + lVar49 + 0x40))
                    ;
                    auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar46 + 0x140)
                                              ,auVar80,*(undefined1 (*) [16])
                                                        ((long)piVar43 + lVar49));
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x150),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar49 + 0x10))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x160),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar49 + 0x20))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x170),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar49 + 0x30))
                    ;
                    auVar80 = vfmadd231ps_fma(auVar80,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar46 + 0x180),
                                              *(undefined1 (*) [16])((long)piVar43 + lVar49 + 0x40))
                    ;
                    *pauVar54 = auVar80;
                    pauVar54 = pauVar54 + 1;
                    lVar49 = lVar49 + 0x20;
                  }
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar49 + lVar33);
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar49 + lVar33);
                  pvVar60 = (void *)((long)pvVar60 + lVar49 + lVar33);
                  pvVar34 = (void *)((long)pvVar34 + lVar49 + lVar33);
                  piVar43 = (pointer)((long)piVar43 + lVar49 + lVar33);
                }
              }
            }
            goto LAB_003ab4e0;
          }
        }
        else if ((iVar28 == 3) && (iVar62 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var36) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var36) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var36) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var36) == 1)) {
            iVar28 = top_blob->w;
            lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
            uVar52 = 0;
            uVar65 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar65 = uVar52;
            }
            uVar32 = (ulong)(uint)local_298.c;
            if (local_298.c < 1) {
              uVar32 = uVar52;
            }
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar52 != uVar32;
                uVar52 = uVar52 + 1) {
              if (lVar50 == 0) {
                uVar68 = 0;
                uVar75 = 0;
              }
              else {
                puVar1 = (undefined8 *)(lVar50 + uVar52 * 0x10);
                uVar68 = *puVar1;
                uVar75 = puVar1[1];
              }
              pauVar53 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar52 * top_blob->elemsize + (long)top_blob->data);
              pvVar60 = (this->weight_data_tm).data;
              lVar33 = (long)(this->weight_data_tm).w * uVar52 * (this->weight_data_tm).elemsize;
              ppp_Var39 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar52 * local_298.elemsize);
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33);
              auVar126 = *pauVar54;
              auVar113 = *pauVar54;
              auVar79 = *pauVar54;
              auVar135 = *pauVar54;
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x10);
              auVar127 = *pauVar54;
              auVar114 = *pauVar54;
              auVar111 = *pauVar54;
              auVar109 = *pauVar54;
              auVar96 = *pauVar54;
              auVar81 = *pauVar54;
              auVar70 = *pauVar54;
              auVar22 = *pauVar54;
              auVar86 = *pauVar54;
              auVar143 = *pauVar54;
              auVar120 = *pauVar54;
              auVar106 = *pauVar54;
              auVar77 = *pauVar54;
              auVar76 = *pauVar54;
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x20);
              uStack_240 = *(undefined8 *)(*pauVar54 + 8);
              auVar128 = *pauVar54;
              auVar115 = *pauVar54;
              auVar91 = *pauVar54;
              auVar90 = *pauVar54;
              local_248._0_4_ = (int)*(undefined8 *)*pauVar54;
              local_248._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar54 >> 0x20);
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x30);
              local_238 = *(ulong *)*pauVar54;
              uStack_230 = *(undefined8 *)(*pauVar54 + 8);
              auVar129 = *pauVar54;
              auVar116 = *pauVar54;
              auVar92 = *pauVar54;
              auVar107 = *pauVar54;
              auVar85 = *(undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x40);
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x50);
              auVar130 = *pauVar54;
              auVar122 = *pauVar54;
              auVar93 = *pauVar54;
              auVar117 = *pauVar54;
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x60);
              auVar131 = *pauVar54;
              auVar123 = *pauVar54;
              auVar112 = *pauVar54;
              auVar110 = *pauVar54;
              auVar108 = *pauVar54;
              auVar94 = *pauVar54;
              auVar71 = *pauVar54;
              auVar69 = *pauVar54;
              auVar103 = *pauVar54;
              auVar87 = *pauVar54;
              auVar141 = *pauVar54;
              auVar118 = *pauVar54;
              auVar78 = *pauVar54;
              auVar119 = *pauVar54;
              pauVar54 = (undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x70);
              auVar132 = *pauVar54;
              auVar125 = *pauVar54;
              auVar95 = *pauVar54;
              auVar121 = *pauVar54;
              auVar80 = *(undefined1 (*) [16])((long)pvVar60 + lVar33 + 0x80);
              ppp_Var42 = (_func_int ***)((long)ppp_Var39 + (long)local_298.w * local_298.elemsize);
              pauVar54 = (undefined1 (*) [16])
                         ((long)ppp_Var39 + (long)local_298.w * local_298.elemsize * 2);
              for (iVar41 = 0; iVar41 != (int)uVar65; iVar41 = iVar41 + 1) {
                ppp_Var64 = ppp_Var39 + 4;
                ppp_Var38 = ppp_Var42 + 4;
                pauVar35 = pauVar54 + 2;
                lVar33 = 0;
                for (iVar44 = 0; iVar44 + 7 < iVar28; iVar44 = iVar44 + 8) {
                  auVar23._8_8_ = uVar75;
                  auVar23._0_8_ = uVar68;
                  auVar133 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar33),
                                             auVar135,auVar23);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 2) + lVar33);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 4) + lVar33);
                  auVar6 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 6) + lVar33);
                  auVar133 = vfmadd231ps_fma(auVar133,auVar4,auVar76);
                  auVar133 = vfmadd231ps_fma(auVar133,auVar90,auVar5);
                  auVar136 = vfmadd231ps_fma(auVar133,auVar107,
                                             *(undefined1 (*) [16])((long)ppp_Var42 + lVar33));
                  auVar133 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar33);
                  auVar134 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar33);
                  auVar136 = vfmadd231ps_fma(auVar136,auVar85,auVar133);
                  auVar136 = vfmadd231ps_fma(auVar136,auVar117,auVar134);
                  auVar142 = vfmadd231ps_fma(auVar136,auVar119,
                                             *(undefined1 (*) [16])(*pauVar54 + lVar33));
                  auVar136 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 6) + lVar33);
                  auVar139 = *(undefined1 (*) [16])(pauVar54[1] + lVar33);
                  auVar140 = *(undefined1 (*) [16])(pauVar54[2] + lVar33);
                  auVar24 = *(undefined1 (*) [16])(pauVar54[3] + lVar33);
                  auVar142 = vfmadd231ps_fma(auVar142,auVar121,auVar139);
                  auVar142 = vfmadd231ps_fma(auVar142,auVar80,auVar140);
                  *(undefined1 (*) [16])(*pauVar53 + lVar33) = auVar142;
                  auVar4 = vfmadd213ps_fma(auVar4,auVar135,auVar23);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar77);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar90,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar107,auVar133);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar134,auVar85);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar117,auVar136);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar139,auVar78);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar121,auVar140);
                  auVar139 = vfmadd231ps_fma(auVar4,auVar80,auVar24);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 8) + lVar33);
                  auVar133 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 8) + lVar33);
                  auVar145 = *(undefined1 (*) [16])(pauVar54[4] + lVar33);
                  auVar142 = *(undefined1 (*) [16])(pauVar54[4] + lVar33);
                  *(undefined1 (*) [16])(pauVar53[1] + lVar33) = auVar139;
                  auVar5 = vfmadd213ps_fma(auVar5,auVar135,auVar23);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar106);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar90,auVar4);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar107,auVar134);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar136,auVar85);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar117,auVar133);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar140,auVar118);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar121,auVar24);
                  auVar140 = vfmadd231ps_fma(auVar5,auVar80,auVar142);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 10) + lVar33);
                  auVar134 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 10) + lVar33)
                  ;
                  auVar139 = *(undefined1 (*) [16])(pauVar54[5] + lVar33);
                  *(undefined1 (*) [16])(pauVar53[2] + lVar33) = auVar140;
                  auVar6 = vfmadd213ps_fma(auVar6,auVar135,auVar23);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar4,auVar120);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar90,auVar5);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar107,auVar136);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar133,auVar85);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar117,auVar134);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar24,auVar141);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar121,auVar142);
                  auVar140 = vfmadd231ps_fma(auVar6,auVar80,auVar139);
                  auVar6 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 0xc) + lVar33);
                  auVar136 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var42 + 0xc) + lVar33);
                  local_228 = *(undefined1 (*) [16])(pauVar54[6] + lVar33);
                  *(undefined1 (*) [16])(pauVar53[3] + lVar33) = auVar140;
                  auVar4 = vfmadd213ps_fma(auVar4,auVar135,auVar23);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar143);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar90,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar107,auVar133);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar134,auVar85);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar117,auVar136);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar145,auVar87);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar121,auVar139);
                  auVar142 = vfmadd231ps_fma(auVar4,auVar80,local_228);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 0xe) + lVar33);
                  auVar133 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var42 + 0xe) + lVar33);
                  auVar140 = *(undefined1 (*) [16])(pauVar54[7] + lVar33);
                  *(undefined1 (*) [16])(pauVar53[4] + lVar33) = auVar142;
                  auVar5 = vfmadd213ps_fma(auVar5,auVar135,auVar23);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar86);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar90,auVar4);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar107,auVar134);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar136,auVar85);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar117,auVar133);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar139,auVar103);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar121,local_228);
                  auVar142 = vfmadd231ps_fma(auVar5,auVar80,auVar140);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 0x10) + lVar33)
                  ;
                  auVar134 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var42 + 0x10) + lVar33);
                  auVar139 = *(undefined1 (*) [16])(pauVar54[8] + lVar33);
                  *(undefined1 (*) [16])(pauVar53[5] + lVar33) = auVar142;
                  auVar6 = vfmadd213ps_fma(auVar6,auVar135,auVar23);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar4,auVar22);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar90,auVar5);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar107,auVar136);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar85,auVar133);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar117,auVar134);
                  auVar6 = vfmadd231ps_fma(auVar6,local_228,auVar69);
                  auVar4 = vfmadd213ps_fma(auVar4,auVar135,auVar23);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar70);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar90,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 0x12) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar107,auVar133);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar85,auVar134);
                  auVar5 = vfmadd231ps_fma(auVar6,auVar121,auVar140);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar117,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 0x12) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar140,auVar71);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar121,auVar139);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar80,
                                           *(undefined1 (*) [16])(pauVar54[9] + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar80,auVar139);
                  *(undefined1 (*) [16])(pauVar53[6] + lVar33) = auVar5;
                  *(undefined1 (*) [16])(pauVar53[7] + lVar33) = auVar4;
                  lVar33 = lVar33 + 0x80;
                  ppp_Var64 = ppp_Var64 + 0x10;
                  ppp_Var38 = ppp_Var38 + 0x10;
                  pauVar35 = pauVar35 + 8;
                }
                for (; iVar44 + 3 < iVar28; iVar44 = iVar44 + 4) {
                  auVar4._8_8_ = uVar75;
                  auVar4._0_8_ = uVar68;
                  auVar133 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar33),
                                             auVar79,auVar4);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 2) + lVar33);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 4) + lVar33);
                  auVar6 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 6) + lVar33);
                  auVar133 = vfmadd231ps_fma(auVar133,auVar4,auVar81);
                  auVar133 = vfmadd231ps_fma(auVar133,auVar91,auVar5);
                  auVar136 = vfmadd231ps_fma(auVar133,auVar92,
                                             *(undefined1 (*) [16])((long)ppp_Var42 + lVar33));
                  auVar133 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar33);
                  auVar134 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar33);
                  auVar136 = vfmadd231ps_fma(auVar136,auVar85,auVar133);
                  auVar136 = vfmadd231ps_fma(auVar136,auVar93,auVar134);
                  auVar142 = vfmadd231ps_fma(auVar136,auVar94,
                                             *(undefined1 (*) [16])(*pauVar54 + lVar33));
                  auVar136 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 6) + lVar33);
                  auVar139 = *(undefined1 (*) [16])(pauVar54[1] + lVar33);
                  auVar140 = *(undefined1 (*) [16])(pauVar54[2] + lVar33);
                  local_228 = *(undefined1 (*) [16])(pauVar54[3] + lVar33);
                  auVar142 = vfmadd231ps_fma(auVar142,auVar95,auVar139);
                  auVar142 = vfmadd231ps_fma(auVar142,auVar80,auVar140);
                  *(undefined1 (*) [16])(*pauVar53 + lVar33) = auVar142;
                  auVar24._8_8_ = uVar75;
                  auVar24._0_8_ = uVar68;
                  auVar4 = vfmadd213ps_fma(auVar4,auVar79,auVar24);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar96);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar91,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar92,auVar133);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar134,auVar85);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar93,auVar136);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar139,auVar108);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar95,auVar140);
                  auVar142 = vfmadd231ps_fma(auVar4,auVar80,local_228);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var39 + 8) + lVar33);
                  auVar133 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var42 + 8) + lVar33);
                  auVar139 = *(undefined1 (*) [16])(pauVar54[4] + lVar33);
                  *(undefined1 (*) [16])(pauVar53[1] + lVar33) = auVar142;
                  auVar5 = vfmadd213ps_fma(auVar5,auVar79,auVar24);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar109);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar91,auVar4);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar92,auVar134);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar136,auVar85);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar93,auVar133);
                  auVar134 = vfmadd231ps_fma(auVar5,auVar140,auVar110);
                  auVar5 = vfmadd213ps_fma(auVar6,auVar79,auVar24);
                  auVar4 = vfmadd231ps_fma(auVar5,auVar4,auVar111);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar91,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 10) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar92,auVar136);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar133,auVar85);
                  auVar5 = vfmadd231ps_fma(auVar134,auVar95,local_228);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar93,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 10) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,local_228,auVar112);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar95,auVar139);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar80,
                                           *(undefined1 (*) [16])(pauVar54[5] + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar80,auVar139);
                  *(undefined1 (*) [16])(pauVar53[2] + lVar33) = auVar5;
                  *(undefined1 (*) [16])(pauVar53[3] + lVar33) = auVar4;
                  lVar33 = lVar33 + 0x40;
                  ppp_Var64 = ppp_Var64 + 8;
                  ppp_Var38 = ppp_Var38 + 8;
                  pauVar35 = pauVar35 + 4;
                }
                for (; iVar44 + 1 < iVar28; iVar44 = iVar44 + 2) {
                  auVar6._8_8_ = uVar75;
                  auVar6._0_8_ = uVar68;
                  auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar33),auVar113
                                           ,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar114,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 2) + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar4,auVar115,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 4) + lVar33));
                  auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 2) + lVar33),
                                           auVar113,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar114,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 4) + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar116,
                                           *(undefined1 (*) [16])((long)ppp_Var42 + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar115,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var39 + 6) + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar85,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar116,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 2) + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar122,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar85,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 4) + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar123,
                                           *(undefined1 (*) [16])(*pauVar54 + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar125,
                                           *(undefined1 (*) [16])(pauVar54[1] + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar122,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var42 + 6) + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar123,
                                           *(undefined1 (*) [16])(pauVar54[1] + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar125,
                                           *(undefined1 (*) [16])(pauVar54[2] + lVar33));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar80,
                                           *(undefined1 (*) [16])(pauVar54[3] + lVar33));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar80,
                                           *(undefined1 (*) [16])(pauVar54[2] + lVar33));
                  *(undefined1 (*) [16])(*pauVar53 + lVar33) = auVar5;
                  *(undefined1 (*) [16])(pauVar53[1] + lVar33) = auVar4;
                  lVar33 = lVar33 + 0x20;
                  ppp_Var64 = ppp_Var64 + 4;
                  ppp_Var38 = ppp_Var38 + 4;
                  pauVar35 = pauVar35 + 2;
                }
                pauVar53 = (undefined1 (*) [16])(*pauVar53 + lVar33);
                ppp_Var39 = ppp_Var64;
                for (; iVar44 < iVar28; iVar44 = iVar44 + 1) {
                  auVar5._8_8_ = uVar75;
                  auVar5._0_8_ = uVar68;
                  auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])(ppp_Var39 + -4),auVar126,auVar5);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar127,*(undefined1 (*) [16])(ppp_Var39 + -2));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar128,*(undefined1 (*) [16])ppp_Var39);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar129,*(undefined1 (*) [16])(ppp_Var38 + -4));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar85,*(undefined1 (*) [16])(ppp_Var38 + -2));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar130,*(undefined1 (*) [16])ppp_Var38);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar131,pauVar35[-2]);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar132,pauVar35[-1]);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar80,*pauVar35);
                  *pauVar53 = auVar4;
                  pauVar53 = pauVar53 + 1;
                  ppp_Var39 = ppp_Var39 + 2;
                  ppp_Var38 = ppp_Var38 + 2;
                  pauVar35 = pauVar35 + 1;
                }
                ppp_Var42 = ppp_Var38;
                pauVar54 = pauVar35;
              }
            }
          }
          else {
            iVar62 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var36) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var36) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var36) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var36) != 2)) goto LAB_003aa433;
            iVar28 = top_blob->w;
            lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
            uVar52 = 0;
            uVar65 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar65 = uVar52;
            }
            uVar40 = local_298.c;
            if (local_298.c < 1) {
              uVar40 = 0;
            }
            lVar33 = (long)((local_298.w - iVar28) * 8) * 4;
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar52 != uVar40;
                uVar52 = uVar52 + 1) {
              if (lVar50 == 0) {
                auVar85 = ZEXT816(0) << 0x40;
              }
              else {
                auVar85 = *(undefined1 (*) [16])(lVar50 + uVar52 * 0x10);
              }
              pauVar54 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar52 * top_blob->elemsize + (long)top_blob->data);
              pvVar17 = (this->weight_data_tm).data;
              lVar49 = (long)(this->weight_data_tm).w * uVar52 * (this->weight_data_tm).elemsize;
              ppp_Var39 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar52 * local_298.elemsize);
              ppp_Var42 = (_func_int ***)((long)ppp_Var39 + (long)local_298.w * local_298.elemsize);
              pvVar60 = (void *)((long)ppp_Var39 + (long)local_298.w * local_298.elemsize * 2);
              auVar80 = *(undefined1 (*) [16])((long)pvVar17 + lVar49);
              auVar135 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x10);
              auVar76 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x20);
              auVar90 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x30);
              auVar107 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x40);
              auVar117 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x50);
              auVar119 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x60);
              auVar121 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x70);
              auVar77 = *(undefined1 (*) [16])((long)pvVar17 + lVar49 + 0x80);
              for (iVar41 = 0; iVar41 != (int)uVar65; iVar41 = iVar41 + 1) {
                lVar49 = 0;
                for (iVar44 = 0; iVar44 + 3 < iVar28; iVar44 = iVar44 + 4) {
                  auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar49),auVar80
                                            ,auVar85);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar135,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 2) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar76,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar90,
                                            *(undefined1 (*) [16])((long)ppp_Var42 + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar107,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar117,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar119,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49));
                  auVar120 = vfmadd231ps_fma(auVar78,auVar121,
                                             *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x10));
                  auVar78 = *(undefined1 (*) [16])((long)(ppp_Var39 + 8) + lVar49);
                  auVar106 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar49),
                                             auVar80,auVar85);
                  auVar118 = vfmadd231ps_fma(auVar106,auVar135,
                                             *(undefined1 (*) [16])((long)(ppp_Var39 + 6) + lVar49))
                  ;
                  auVar106 = *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar49);
                  auVar118 = vfmadd231ps_fma(auVar118,auVar76,auVar78);
                  auVar141 = vfmadd231ps_fma(auVar118,auVar90,
                                             *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar49))
                  ;
                  auVar118 = *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x20);
                  auVar120 = vfmadd231ps_fma(auVar120,auVar77,auVar118);
                  auVar141 = vfmadd231ps_fma(auVar141,auVar107,
                                             *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar49))
                  ;
                  auVar141 = vfmadd231ps_fma(auVar141,auVar117,auVar106);
                  auVar141 = vfmadd231ps_fma(auVar141,auVar119,auVar118);
                  auVar118 = *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x40);
                  auVar141 = vfmadd231ps_fma(auVar141,auVar121,
                                             *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x30));
                  *pauVar54 = auVar120;
                  auVar141 = vfmadd231ps_fma(auVar141,auVar77,auVar118);
                  auVar120 = *(undefined1 (*) [16])((long)(ppp_Var39 + 0xc) + lVar49);
                  auVar78 = vfmadd213ps_fma(auVar78,auVar80,auVar85);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar135,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 10) + lVar49))
                  ;
                  auVar78 = vfmadd231ps_fma(auVar78,auVar76,auVar120);
                  auVar106 = vfmadd231ps_fma(auVar78,auVar90,auVar106);
                  auVar78 = *(undefined1 (*) [16])((long)(ppp_Var42 + 0xc) + lVar49);
                  auVar106 = vfmadd231ps_fma(auVar106,auVar107,
                                             *(undefined1 (*) [16])((long)(ppp_Var42 + 10) + lVar49)
                                            );
                  auVar106 = vfmadd231ps_fma(auVar106,auVar117,auVar78);
                  auVar118 = vfmadd231ps_fma(auVar106,auVar119,auVar118);
                  auVar106 = *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x60);
                  auVar143 = vfmadd231ps_fma(auVar118,auVar121,
                                             *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x50));
                  pauVar54[1] = auVar141;
                  auVar118 = vfmadd213ps_fma(auVar120,auVar80,auVar85);
                  auVar118 = vfmadd231ps_fma(auVar118,auVar135,
                                             *(undefined1 (*) [16])
                                              ((long)(ppp_Var39 + 0xe) + lVar49));
                  auVar118 = vfmadd231ps_fma(auVar118,auVar76,
                                             *(undefined1 (*) [16])
                                              ((long)(ppp_Var39 + 0x10) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar118,auVar90,auVar78);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar107,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 0xe) + lVar49)
                                           );
                  auVar78 = vfmadd231ps_fma(auVar78,auVar117,
                                            *(undefined1 (*) [16])
                                             ((long)(ppp_Var42 + 0x10) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar119,auVar106);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar121,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x70));
                  auVar106 = vfmadd231ps_fma(auVar143,auVar77,auVar106);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar77,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x80));
                  pauVar54[2] = auVar106;
                  pauVar54[3] = auVar78;
                  pauVar54 = pauVar54 + 4;
                  lVar49 = lVar49 + 0x80;
                }
                for (; iVar44 + 1 < iVar28; iVar44 = iVar44 + 2) {
                  auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar49),auVar80
                                            ,auVar85);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar135,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 2) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar76,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar90,
                                            *(undefined1 (*) [16])((long)ppp_Var42 + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar107,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar117,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar119,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49));
                  auVar106 = vfmadd231ps_fma(auVar78,auVar121,
                                             *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x10));
                  auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar49),
                                            auVar80,auVar85);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar135,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 6) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar76,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 8) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar90,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar107,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 6) + lVar49));
                  auVar118 = vfmadd231ps_fma(auVar78,auVar117,
                                             *(undefined1 (*) [16])((long)(ppp_Var42 + 8) + lVar49))
                  ;
                  auVar78 = *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x20);
                  auVar118 = vfmadd231ps_fma(auVar118,auVar119,auVar78);
                  auVar118 = vfmadd231ps_fma(auVar118,auVar121,
                                             *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x30));
                  auVar78 = vfmadd231ps_fma(auVar106,auVar77,auVar78);
                  auVar106 = vfmadd231ps_fma(auVar118,auVar77,
                                             *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x40));
                  *pauVar54 = auVar78;
                  pauVar54[1] = auVar106;
                  pauVar54 = pauVar54 + 2;
                  lVar49 = lVar49 + 0x40;
                }
                for (; iVar44 < iVar28; iVar44 = iVar44 + 1) {
                  auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var39 + lVar49),auVar80
                                            ,auVar85);
                  auVar78 = vfmadd231ps_fma(auVar78,auVar135,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 2) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar76,
                                            *(undefined1 (*) [16])((long)(ppp_Var39 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar90,
                                            *(undefined1 (*) [16])((long)ppp_Var42 + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar107,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 2) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar117,
                                            *(undefined1 (*) [16])((long)(ppp_Var42 + 4) + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar119,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar121,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x10));
                  auVar78 = vfmadd231ps_fma(auVar78,auVar77,
                                            *(undefined1 (*) [16])((long)pvVar60 + lVar49 + 0x20));
                  *pauVar54 = auVar78;
                  pauVar54 = pauVar54 + 1;
                  lVar49 = lVar49 + 0x20;
                }
                ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar49 + lVar33);
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar49 + lVar33);
                pvVar60 = (void *)((long)pvVar60 + lVar49 + lVar33);
              }
            }
          }
          goto LAB_003ab4e0;
        }
LAB_003aa433:
        uVar63 = iVar62 * iVar28;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar63,(allocator_type *)&opt_p);
        pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var36 = pp_Var20[-3];
        iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var36);
        iVar62 = *(int *)(&this->field_0xdc + (long)p_Var36);
        iVar14 = *(int *)(&this->field_0xd4 + (long)p_Var36);
        lVar50 = 0;
        iVar45 = 0;
        for (iVar48 = 0; iVar48 < *(int *)(&this->field_0xd8 + (long)p_Var36); iVar48 = iVar48 + 1)
        {
          for (lVar33 = 0; (int)lVar33 < *(int *)(&this->field_0xd4 + (long)p_Var36);
              lVar33 = lVar33 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar50 + lVar33] = iVar45;
            p_Var36 = pp_Var20[-3];
            iVar45 = iVar45 + *(int *)(&this->field_0xdc + (long)p_Var36);
          }
          iVar45 = iVar45 + (iVar26 * iVar28 - iVar62 * iVar14);
          lVar50 = (int)lVar50 + lVar33;
        }
        local_238 = CONCAT44(local_238._4_4_,uVar63 * 4);
        uVar52 = 0;
        uVar65 = (ulong)uVar63;
        if ((int)uVar63 < 1) {
          uVar65 = uVar52;
        }
        uVar32 = (ulong)uVar40;
        if ((int)uVar40 < 1) {
          uVar32 = uVar52;
        }
        auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar118._8_4_ = 0x3f000000;
        auVar118._0_8_ = 0x3f0000003f000000;
        auVar118._12_4_ = 0x3f000000;
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar141._8_4_ = 0xc2b0c0a5;
        auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar141._12_4_ = 0xc2b0c0a5;
        auVar120._8_4_ = 0xb95e8083;
        auVar120._0_8_ = 0xb95e8083b95e8083;
        auVar120._12_4_ = 0xb95e8083;
        auVar106._8_4_ = 0x3ab743ce;
        auVar106._0_8_ = 0x3ab743ce3ab743ce;
        auVar106._12_4_ = 0x3ab743ce;
        for (uVar37 = 0; uVar37 != uVar32; uVar37 = uVar37 + 1) {
          local_2a8 = (int)uVar52;
          pvVar60 = (void *)(top_blob->cstep * uVar37 * top_blob->elemsize + (long)top_blob->data);
          local_248._0_4_ = (int)uVar37;
          local_248._4_4_ = (undefined4)(uVar37 >> 0x20);
          pvVar17 = (this->weight_data_tm).data;
          for (iVar28 = 0; iVar28 <= local_2e8; iVar28 = iVar28 + 1) {
            pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
            for (lVar50 = 0; lVar50 <= iVar41; lVar50 = lVar50 + 1) {
              p_Var36 = pp_Var20[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var36) == 0) {
                auVar85 = ZEXT816(0) << 0x40;
              }
              else {
                auVar85 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x1b0 + (long)p_Var36) + uVar37 * 0x10);
              }
              for (lVar33 = 0; uVar65 * 4 != lVar33; lVar33 = lVar33 + 4) {
                auVar85 = vfmadd231ps_fma(auVar85,*(undefined1 (*) [16])
                                                   ((long)pvVar17 + lVar33 * 4 + (long)local_2a8 * 4
                                                   ),
                                          *(undefined1 (*) [16])
                                           ((long)&((Allocator *)
                                                   ((long)local_298.data +
                                                   (long)*(int *)((long)_space_ofs.
                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar33)
                                                  * 2 * 8))->_vptr_Allocator +
                                           (long)(*(int *)(&this->field_0xe4 + (long)p_Var36) *
                                                  (int)lVar50 * 4) * 4 +
                                           (long)iVar28 *
                                           (long)*(int *)(&this->field_0xe8 + (long)p_Var36) *
                                           (long)local_298.w * local_298.elemsize +
                                           local_298.cstep * uVar37 * local_298.elemsize));
              }
              auVar87 = auVar85;
              if (*(int *)(&this->field_0x110 + (long)p_Var36) - 1U < 6) {
                auVar80 = auVar74._0_16_;
                auVar87 = vmaxps_avx(auVar85,auVar80);
                switch(*(int *)(&this->field_0x110 + (long)p_Var36)) {
                case 2:
                  auVar85 = vminps_avx(auVar85,auVar80);
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var36);
                  auVar144._4_4_ = uVar3;
                  auVar144._0_4_ = uVar3;
                  auVar144._8_4_ = uVar3;
                  auVar144._12_4_ = uVar3;
                  auVar87 = vfmadd231ps_fma(auVar87,auVar85,auVar144);
                  break;
                case 3:
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var36);
                  auVar82._4_4_ = uVar3;
                  auVar82._0_4_ = uVar3;
                  auVar82._8_4_ = uVar3;
                  auVar82._12_4_ = uVar3;
                  uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var36))[1];
                  auVar148._4_4_ = uVar3;
                  auVar148._0_4_ = uVar3;
                  auVar148._8_4_ = uVar3;
                  auVar148._12_4_ = uVar3;
                  auVar85 = vmaxps_avx(auVar85,auVar82);
                  auVar87 = vminps_avx(auVar148,auVar85);
                  break;
                case 4:
                  auVar83._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                  auVar83._8_4_ = -auVar85._8_4_;
                  auVar83._12_4_ = -auVar85._12_4_;
                  auVar97._8_4_ = 0x42b0c0a5;
                  auVar97._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar97._12_4_ = 0x42b0c0a5;
                  auVar85 = vminps_avx(auVar83,auVar97);
                  auVar98._8_4_ = 0xc2b0c0a5;
                  auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar98._12_4_ = 0xc2b0c0a5;
                  auVar135 = vmaxps_avx(auVar85,auVar98);
                  auVar124._8_4_ = 0x3fb8aa3b;
                  auVar124._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar124._12_4_ = 0x3fb8aa3b;
                  auVar85 = vfmadd213ps_fma(auVar124,auVar135,auVar118);
                  auVar149._0_4_ = (int)auVar85._0_4_;
                  auVar149._4_4_ = (int)auVar85._4_4_;
                  auVar149._8_4_ = (int)auVar85._8_4_;
                  auVar149._12_4_ = (int)auVar85._12_4_;
                  auVar80 = vcvtdq2ps_avx(auVar149);
                  auVar85 = vcmpps_avx(auVar85,auVar80,1);
                  auVar85 = vandps_avx(auVar85,auVar143);
                  auVar85 = vsubps_avx(auVar80,auVar85);
                  auVar99._8_4_ = 0x3f318000;
                  auVar99._0_8_ = 0x3f3180003f318000;
                  auVar99._12_4_ = 0x3f318000;
                  auVar80 = vfmsub231ps_fma(auVar135,auVar85,auVar99);
                  auVar100._8_4_ = 0x395e8083;
                  auVar100._0_8_ = 0x395e8083395e8083;
                  auVar100._12_4_ = 0x395e8083;
                  auVar135 = vfmsub231ps_fma(auVar80,auVar85,auVar100);
                  auVar150._0_4_ = auVar135._0_4_ * auVar135._0_4_;
                  auVar150._4_4_ = auVar135._4_4_ * auVar135._4_4_;
                  auVar150._8_4_ = auVar135._8_4_ * auVar135._8_4_;
                  auVar150._12_4_ = auVar135._12_4_ * auVar135._12_4_;
                  auVar137._8_4_ = 0x39506967;
                  auVar137._0_8_ = 0x3950696739506967;
                  auVar137._12_4_ = 0x39506967;
                  auVar101._8_4_ = 0x3ab743ce;
                  auVar101._0_8_ = 0x3ab743ce3ab743ce;
                  auVar101._12_4_ = 0x3ab743ce;
                  auVar80 = vfmadd213ps_fma(auVar137,auVar135,auVar101);
                  auVar102._8_4_ = 0x3c088908;
                  auVar102._0_8_ = 0x3c0889083c088908;
                  auVar102._12_4_ = 0x3c088908;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar135,auVar102);
                  auVar72._8_4_ = 0x3d2aa9c1;
                  auVar72._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar72._12_4_ = 0x3d2aa9c1;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar135,auVar72);
                  auVar73._8_4_ = 0x3e2aaaaa;
                  auVar73._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar73._12_4_ = 0x3e2aaaaa;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar135,auVar73);
                  auVar80 = vfmadd213ps_fma(auVar80,auVar135,auVar118);
                  auVar80 = vfmadd213ps_fma(auVar80,auVar150,auVar135);
                  auVar138._0_4_ = auVar80._0_4_ + 1.0;
                  auVar138._4_4_ = auVar80._4_4_ + 1.0;
                  auVar138._8_4_ = auVar80._8_4_ + 1.0;
                  auVar138._12_4_ = auVar80._12_4_ + 1.0;
                  auVar84._0_4_ = (int)auVar85._0_4_;
                  auVar84._4_4_ = (int)auVar85._4_4_;
                  auVar84._8_4_ = (int)auVar85._8_4_;
                  auVar84._12_4_ = (int)auVar85._12_4_;
                  auVar85 = vpslld_avx(auVar84,0x17);
                  auVar85 = vpaddd_avx(auVar143,auVar85);
                  auVar80 = vfmadd213ps_fma(auVar85,auVar138,auVar143);
                  auVar74 = ZEXT464(0) << 0x20;
                  auVar85 = vrcpps_avx(auVar80);
                  auVar80 = vfmsub213ps_fma(auVar80,auVar85,auVar143);
                  auVar87 = vfnmadd132ps_fma(auVar80,auVar85,auVar85);
                  break;
                case 5:
                  auVar139._8_4_ = 0x42b0c0a5;
                  auVar139._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar139._12_4_ = 0x42b0c0a5;
                  auVar80 = vminps_avx(auVar85,auVar139);
                  auVar76 = vmaxps_avx(auVar141,auVar80);
                  auVar142._8_4_ = 0x3fb8aa3b;
                  auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar142._12_4_ = 0x3fb8aa3b;
                  auVar80 = vfmadd213ps_fma(auVar142,auVar76,auVar118);
                  auVar145._0_4_ = (int)auVar80._0_4_;
                  auVar145._4_4_ = (int)auVar80._4_4_;
                  auVar145._8_4_ = (int)auVar80._8_4_;
                  auVar145._12_4_ = (int)auVar80._12_4_;
                  auVar135 = vcvtdq2ps_avx(auVar145);
                  auVar80 = vcmpps_avx(auVar80,auVar135,1);
                  auVar80 = vandps_avx(auVar80,auVar143);
                  auVar80 = vsubps_avx(auVar135,auVar80);
                  auVar140._8_4_ = 0x3f318000;
                  auVar140._0_8_ = 0x3f3180003f318000;
                  auVar140._12_4_ = 0x3f318000;
                  auVar135 = vfmsub231ps_fma(auVar76,auVar80,auVar140);
                  auVar76 = vfnmsub231ps_fma(auVar135,auVar80,auVar120);
                  auVar146._0_4_ = auVar76._0_4_ * auVar76._0_4_;
                  auVar146._4_4_ = auVar76._4_4_ * auVar76._4_4_;
                  auVar146._8_4_ = auVar76._8_4_ * auVar76._8_4_;
                  auVar146._12_4_ = auVar76._12_4_ * auVar76._12_4_;
                  auVar91._8_4_ = 0x39506967;
                  auVar91._0_8_ = 0x3950696739506967;
                  auVar91._12_4_ = 0x39506967;
                  auVar135 = vfmadd213ps_fma(auVar91,auVar76,auVar106);
                  auVar122._8_4_ = 0x3c088908;
                  auVar122._0_8_ = 0x3c0889083c088908;
                  auVar122._12_4_ = 0x3c088908;
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar122);
                  auVar123._8_4_ = 0x3d2aa9c1;
                  auVar123._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar123._12_4_ = 0x3d2aa9c1;
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar123);
                  auVar108._8_4_ = 0x3e2aaaaa;
                  auVar108._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar108._12_4_ = 0x3e2aaaaa;
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar108);
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar118);
                  auVar135 = vfmadd213ps_fma(auVar135,auVar146,auVar76);
                  auVar92._0_4_ = auVar135._0_4_ + 1.0;
                  auVar92._4_4_ = auVar135._4_4_ + 1.0;
                  auVar92._8_4_ = auVar135._8_4_ + 1.0;
                  auVar92._12_4_ = auVar135._12_4_ + 1.0;
                  auVar79._0_4_ = (int)auVar80._0_4_;
                  auVar79._4_4_ = (int)auVar80._4_4_;
                  auVar79._8_4_ = (int)auVar80._8_4_;
                  auVar79._12_4_ = (int)auVar80._12_4_;
                  auVar80 = vpslld_avx(auVar79,0x17);
                  auVar80 = vpaddd_avx(auVar143,auVar80);
                  auVar107 = vfmadd213ps_fma(auVar80,auVar92,auVar143);
                  auVar93._8_4_ = 0x800000;
                  auVar93._0_8_ = 0x80000000800000;
                  auVar93._12_4_ = 0x800000;
                  auVar80 = vmaxps_avx(auVar107,auVar93);
                  auVar135 = vpsrld_avx(auVar80,0x17);
                  auVar109._8_4_ = 0xffffff82;
                  auVar109._0_8_ = 0xffffff82ffffff82;
                  auVar109._12_4_ = 0xffffff82;
                  auVar135 = vpaddd_avx(auVar135,auVar109);
                  auVar110._8_4_ = 0x807fffff;
                  auVar110._0_8_ = 0x807fffff807fffff;
                  auVar110._12_4_ = 0x807fffff;
                  auVar80 = vandps_avx(auVar80,auVar110);
                  auVar90 = vorps_avx(auVar80,auVar118);
                  auVar76 = vcvtdq2ps_avx(auVar135);
                  auVar111._8_4_ = 0x3f3504f3;
                  auVar111._0_8_ = 0x3f3504f33f3504f3;
                  auVar111._12_4_ = 0x3f3504f3;
                  auVar135 = vcmpps_avx(auVar90,auVar111,1);
                  auVar80 = vandps_avx(auVar135,auVar90);
                  auVar94._0_4_ = auVar90._0_4_ + -1.0 + auVar80._0_4_;
                  auVar94._4_4_ = auVar90._4_4_ + -1.0 + auVar80._4_4_;
                  auVar94._8_4_ = auVar90._8_4_ + -1.0 + auVar80._8_4_;
                  auVar94._12_4_ = auVar90._12_4_ + -1.0 + auVar80._12_4_;
                  auVar80 = vandps_avx(auVar135,auVar143);
                  auVar135 = vsubps_avx(auVar76,auVar80);
                  auVar136._0_4_ = auVar94._0_4_ * auVar94._0_4_;
                  auVar136._4_4_ = auVar94._4_4_ * auVar94._4_4_;
                  auVar136._8_4_ = auVar94._8_4_ * auVar94._8_4_;
                  auVar136._12_4_ = auVar94._12_4_ * auVar94._12_4_;
                  auVar147._8_4_ = 0x3d9021bb;
                  auVar147._0_8_ = 0x3d9021bb3d9021bb;
                  auVar147._12_4_ = 0x3d9021bb;
                  auVar125._8_4_ = 0xbdebd1b8;
                  auVar125._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar125._12_4_ = 0xbdebd1b8;
                  auVar80 = vfmadd213ps_fma(auVar147,auVar94,auVar125);
                  auVar126._8_4_ = 0x3def251a;
                  auVar126._0_8_ = 0x3def251a3def251a;
                  auVar126._12_4_ = 0x3def251a;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar126);
                  auVar127._8_4_ = 0xbdfe5d4f;
                  auVar127._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar127._12_4_ = 0xbdfe5d4f;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar127);
                  auVar128._8_4_ = 0x3e11e9bf;
                  auVar128._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar128._12_4_ = 0x3e11e9bf;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar128);
                  auVar129._8_4_ = 0xbe2aae50;
                  auVar129._0_8_ = 0xbe2aae50be2aae50;
                  auVar129._12_4_ = 0xbe2aae50;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar129);
                  auVar130._8_4_ = 0x3e4cceac;
                  auVar130._0_8_ = 0x3e4cceac3e4cceac;
                  auVar130._12_4_ = 0x3e4cceac;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar130);
                  auVar131._8_4_ = 0xbe7ffffc;
                  auVar131._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar131._12_4_ = 0xbe7ffffc;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar131);
                  auVar132._8_4_ = 0x3eaaaaaa;
                  auVar132._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar132._12_4_ = 0x3eaaaaaa;
                  auVar80 = vfmadd213ps_fma(auVar80,auVar94,auVar132);
                  auVar133._0_4_ = auVar136._0_4_ * auVar94._0_4_ * auVar80._0_4_;
                  auVar133._4_4_ = auVar136._4_4_ * auVar94._4_4_ * auVar80._4_4_;
                  auVar133._8_4_ = auVar136._8_4_ * auVar94._8_4_ * auVar80._8_4_;
                  auVar133._12_4_ = auVar136._12_4_ * auVar94._12_4_ * auVar80._12_4_;
                  auVar80 = vfmadd231ps_fma(auVar133,auVar135,auVar120);
                  auVar76 = vfmsub231ps_fma(auVar80,auVar118,auVar136);
                  auVar22._12_4_ = 0;
                  auVar22._0_12_ = ZEXT412(0);
                  auVar74 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar80 = vcmpps_avx(auVar107,auVar22 << 0x20,2);
                  auVar76 = vsubps_avx(auVar76,auVar94);
                  auVar135 = vfnmadd231ps_fma(auVar76,auVar140,auVar135);
                  auVar95._0_4_ = auVar135._0_4_ + auVar135._0_4_;
                  auVar95._4_4_ = auVar135._4_4_ + auVar135._4_4_;
                  auVar95._8_4_ = auVar135._8_4_ + auVar135._8_4_;
                  auVar95._12_4_ = auVar135._12_4_ + auVar135._12_4_;
                  auVar112._8_4_ = 0x7fffffff;
                  auVar112._0_8_ = 0x7fffffff7fffffff;
                  auVar112._12_4_ = 0x7fffffff;
                  auVar80 = vblendvps_avx(auVar95,auVar112,auVar80);
                  auVar96._8_4_ = 0x42b0c0a5;
                  auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar96._12_4_ = 0x42b0c0a5;
                  auVar80 = vminps_avx(auVar80,auVar96);
                  auVar76 = vmaxps_avx(auVar141,auVar80);
                  auVar80 = vfmadd213ps_fma(auVar142,auVar76,auVar118);
                  auVar113._0_4_ = (int)auVar80._0_4_;
                  auVar113._4_4_ = (int)auVar80._4_4_;
                  auVar113._8_4_ = (int)auVar80._8_4_;
                  auVar113._12_4_ = (int)auVar80._12_4_;
                  auVar135 = vcvtdq2ps_avx(auVar113);
                  auVar80 = vcmpps_avx(auVar80,auVar135,1);
                  auVar80 = vandps_avx(auVar143,auVar80);
                  auVar80 = vsubps_avx(auVar135,auVar80);
                  auVar135 = vfmsub231ps_fma(auVar76,auVar80,auVar140);
                  auVar76 = vfnmsub231ps_fma(auVar135,auVar80,auVar120);
                  auVar114._0_4_ = auVar76._0_4_ * auVar76._0_4_;
                  auVar114._4_4_ = auVar76._4_4_ * auVar76._4_4_;
                  auVar114._8_4_ = auVar76._8_4_ * auVar76._8_4_;
                  auVar114._12_4_ = auVar76._12_4_ * auVar76._12_4_;
                  auVar134._8_4_ = 0x39506967;
                  auVar134._0_8_ = 0x3950696739506967;
                  auVar134._12_4_ = 0x39506967;
                  auVar135 = vfmadd213ps_fma(auVar134,auVar76,auVar106);
                  auVar69._8_4_ = 0x3c088908;
                  auVar69._0_8_ = 0x3c0889083c088908;
                  auVar69._12_4_ = 0x3c088908;
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar69);
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar123);
                  auVar70._8_4_ = 0x3e2aaaaa;
                  auVar70._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar70._12_4_ = 0x3e2aaaaa;
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar70);
                  auVar135 = vfmadd213ps_fma(auVar135,auVar76,auVar118);
                  auVar135 = vfmadd213ps_fma(auVar135,auVar114,auVar76);
                  auVar115._0_4_ = auVar135._0_4_ + 1.0;
                  auVar115._4_4_ = auVar135._4_4_ + 1.0;
                  auVar115._8_4_ = auVar135._8_4_ + 1.0;
                  auVar115._12_4_ = auVar135._12_4_ + 1.0;
                  auVar81._0_4_ = (int)auVar80._0_4_;
                  auVar81._4_4_ = (int)auVar80._4_4_;
                  auVar81._8_4_ = (int)auVar80._8_4_;
                  auVar81._12_4_ = (int)auVar80._12_4_;
                  auVar80 = vpslld_avx(auVar81,0x17);
                  auVar80 = vpaddd_avx(auVar143,auVar80);
                  auVar135 = vfmadd213ps_fma(auVar80,auVar115,auVar143);
                  auVar80 = vrcpps_avx(auVar135);
                  auVar116._0_4_ = auVar80._0_4_ + auVar80._0_4_;
                  auVar116._4_4_ = auVar80._4_4_ + auVar80._4_4_;
                  auVar116._8_4_ = auVar80._8_4_ + auVar80._8_4_;
                  auVar116._12_4_ = auVar80._12_4_ + auVar80._12_4_;
                  auVar71._8_4_ = 0x40000000;
                  auVar71._0_8_ = 0x4000000040000000;
                  auVar71._12_4_ = 0x40000000;
                  auVar135 = vfmsub213ps_fma(auVar135,auVar116,auVar71);
                  auVar80 = vfnmadd213ps_fma(auVar135,auVar80,auVar116);
                  auVar87 = vfmsub213ps_fma(auVar80,auVar85,auVar85);
                  break;
                case 6:
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var36);
                  auVar86._4_4_ = uVar3;
                  auVar86._0_4_ = uVar3;
                  auVar86._8_4_ = uVar3;
                  auVar86._12_4_ = uVar3;
                  uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var36))[1];
                  auVar103._4_4_ = uVar3;
                  auVar103._0_4_ = uVar3;
                  auVar103._8_4_ = uVar3;
                  auVar103._12_4_ = uVar3;
                  auVar135 = vfmadd231ps_fma(auVar103,auVar85,auVar86);
                  auVar80 = vmaxps_avx(auVar80,auVar135);
                  auVar80 = vminps_avx(auVar143,auVar80);
                  auVar87._0_4_ = auVar85._0_4_ * auVar80._0_4_;
                  auVar87._4_4_ = auVar85._4_4_ * auVar80._4_4_;
                  auVar87._8_4_ = auVar85._8_4_ * auVar80._8_4_;
                  auVar87._12_4_ = auVar85._12_4_ * auVar80._12_4_;
                }
              }
              *(undefined1 (*) [16])((long)pvVar60 + lVar50 * 0x10) = auVar87;
            }
            pvVar60 = (void *)((long)pvVar60 + (long)(iVar44 * 4) * 4);
          }
          uVar52 = (ulong)(local_2a8 + uVar63 * 4);
        }
      }
      else {
        if (iVar28 != 8) goto LAB_003a985a;
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var36);
        iVar62 = *(int *)(&this->field_0xd8 + (long)p_Var36);
        if (iVar28 == 5) {
          if (iVar62 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var36) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var36) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var36) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var36) == 1)))) {
              uVar52 = 0;
              uVar65 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar65 = uVar52;
              }
              lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
              uVar32 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar32 = uVar52;
              }
              uVar37 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar37 = uVar52;
              }
              for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar52 != uVar37;
                  uVar52 = uVar52 + 1) {
                if (lVar50 == 0) {
                  auVar89 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar89 = *(undefined1 (*) [32])(lVar50 + uVar52 * 0x20);
                }
                pvVar34 = (void *)(top_blob->cstep * uVar52 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar49 = (long)(this->weight_data_tm).w * uVar52 * (this->weight_data_tm).elemsize;
                ppp_Var39 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar52 * local_298.elemsize);
                lVar33 = (long)local_298.w * local_298.elemsize;
                ppp_Var42 = (_func_int ***)((long)ppp_Var39 + lVar33);
                pvVar60 = (void *)((long)ppp_Var39 + lVar33 * 2);
                pvVar47 = (void *)((long)ppp_Var39 + lVar33 * 3);
                piVar43 = (pointer)((long)ppp_Var39 + lVar33 * 4);
                for (iVar28 = 0; iVar28 != (int)uVar32; iVar28 = iVar28 + 1) {
                  lVar33 = 0;
                  uVar30 = uVar65;
                  while (iVar41 = (int)uVar30, uVar30 = (ulong)(iVar41 - 1), iVar41 != 0) {
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar49),auVar89
                                              ,*(undefined1 (*) [32])((long)ppp_Var39 + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar33)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar33)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var39 + 0xc) + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var39 + 0x10) + lVar33));
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0xa0),
                                              ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)ppp_Var42 + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar33)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar33)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var42 + 0xc) + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var42 + 0x10) + lVar33));
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x140)
                                              ,ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar60 + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar33 + 0x20)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar33 + 0x40)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar33 + 0x60)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar33 + 0x80)
                                             );
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x1e0)
                                              ,ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar47 + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar47 + lVar33 + 0x20)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar47 + lVar33 + 0x40)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar47 + lVar33 + 0x60)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar47 + lVar33 + 0x80)
                                             );
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x280)
                                              ,ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)piVar43 + lVar33));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar33 + 0x20)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar33 + 0x40)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar33 + 0x60)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar33 + 0x80)
                                             );
                    *(undefined1 (*) [32])((long)pvVar34 + lVar33) = ZEXT1632(auVar85);
                    lVar33 = lVar33 + 0x20;
                  }
                  ppp_Var39 = (_func_int ***)((long)(ppp_Var39 + 0x10) + lVar33);
                  ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 0x10) + lVar33);
                  pvVar60 = (void *)((long)pvVar60 + lVar33 + 0x80);
                  pvVar47 = (void *)((long)pvVar47 + lVar33 + 0x80);
                  piVar43 = (pointer)((long)piVar43 + lVar33 + 0x80);
                  pvVar34 = (void *)((long)pvVar34 + lVar33);
                }
              }
            }
            else {
              iVar62 = 5;
              if (((*(int *)(&this->field_0xdc + (long)p_Var36) != 1) ||
                  (*(int *)(&this->field_0xe0 + (long)p_Var36) != 1)) ||
                 ((*(int *)(&this->field_0xe4 + (long)p_Var36) != 2 ||
                  (*(int *)(&this->field_0xe8 + (long)p_Var36) != 2)))) goto LAB_003ab183;
              iVar28 = top_blob->w;
              iVar41 = local_298.w - iVar28;
              lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
              uVar65 = 0;
              if (iVar28 < 1) {
                iVar28 = 0;
              }
              uVar52 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar52 = uVar65;
              }
              uVar32 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar32 = uVar65;
              }
              lVar33 = (long)(iVar41 * 0x10) * 4;
              for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar65 != uVar32;
                  uVar65 = uVar65 + 1) {
                if (lVar50 == 0) {
                  auVar89 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar89 = *(undefined1 (*) [32])(lVar50 + uVar65 * 0x20);
                }
                pauVar55 = (undefined1 (*) [32])
                           (top_blob->cstep * uVar65 * top_blob->elemsize + (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar46 = (long)(this->weight_data_tm).w * uVar65 * (this->weight_data_tm).elemsize;
                ppp_Var39 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar65 * local_298.elemsize);
                lVar49 = (long)local_298.w * local_298.elemsize;
                ppp_Var42 = (_func_int ***)((long)ppp_Var39 + lVar49);
                pvVar60 = (void *)((long)ppp_Var39 + lVar49 * 2);
                pvVar34 = (void *)((long)ppp_Var39 + lVar49 * 3);
                piVar43 = (pointer)((long)ppp_Var39 + lVar49 * 4);
                for (iVar41 = 0; iVar41 != (int)uVar52; iVar41 = iVar41 + 1) {
                  lVar49 = 0;
                  iVar44 = iVar28;
                  while (bVar66 = iVar44 != 0, iVar44 = iVar44 + -1, bVar66) {
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar46),auVar89
                                              ,*(undefined1 (*) [32])((long)ppp_Var39 + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar49)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar49)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var39 + 0xc) + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var39 + 0x10) + lVar49));
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0xa0),
                                              ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)ppp_Var42 + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar49)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar49)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var42 + 0xc) + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var42 + 0x10) + lVar49));
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x140)
                                              ,ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar60 + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x20)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x40)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x60)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x80)
                                             );
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x1e0)
                                              ,ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar34 + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar34 + lVar49 + 0x20)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar34 + lVar49 + 0x40)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar34 + lVar49 + 0x60)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar34 + lVar49 + 0x80)
                                             );
                    auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x280)
                                              ,ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)piVar43 + lVar49));
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar49 + 0x20)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar49 + 0x40)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar49 + 0x60)
                                             );
                    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar46 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar43 + lVar49 + 0x80)
                                             );
                    *pauVar55 = ZEXT1632(auVar85);
                    pauVar55 = pauVar55 + 1;
                    lVar49 = lVar49 + 0x40;
                  }
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar49 + lVar33);
                  ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar49 + lVar33);
                  pvVar60 = (void *)((long)pvVar60 + lVar49 + lVar33);
                  pvVar34 = (void *)((long)pvVar34 + lVar49 + lVar33);
                  piVar43 = (pointer)((long)piVar43 + lVar49 + lVar33);
                }
              }
            }
            goto LAB_003ab4e0;
          }
        }
        else if ((iVar28 == 3) && (iVar62 == 3)) {
          if ((*(int *)(&this->field_0xdc + (long)p_Var36) == 1) &&
             (((*(int *)(&this->field_0xe0 + (long)p_Var36) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var36) == 1)) &&
              (*(int *)(&this->field_0xe8 + (long)p_Var36) == 1)))) {
            iVar28 = top_blob->w;
            iVar41 = top_blob->h;
            lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
            uVar52 = 0;
            uVar65 = (ulong)(uint)local_298.c;
            if (local_298.c < 1) {
              uVar65 = uVar52;
            }
            lVar33 = (long)(iVar28 * 8) * 4;
            lVar49 = (long)(local_298.w * 8 + 0x10) * 4;
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar52 != uVar65;
                uVar52 = uVar52 + 1) {
              if (lVar50 == 0) {
                auVar89 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar89 = *(undefined1 (*) [32])(lVar50 + uVar52 * 0x20);
              }
              pvVar56 = (void *)(top_blob->cstep * uVar52 * top_blob->elemsize +
                                (long)top_blob->data);
              lVar58 = (long)(this->weight_data_tm).w * uVar52 * (this->weight_data_tm).elemsize;
              pvVar17 = (this->weight_data_tm).data;
              pvVar34 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar56);
              ppp_Var39 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar52 * local_298.elemsize);
              lVar46 = (long)local_298.w * local_298.elemsize;
              ppp_Var42 = (_func_int ***)((long)ppp_Var39 + lVar46);
              pvVar60 = (void *)((long)ppp_Var39 + lVar46 * 2);
              pvVar47 = (void *)((long)ppp_Var39 + lVar46 * 3);
              for (uVar40 = 0; (int)(uVar40 | 1) < iVar41; uVar40 = uVar40 + 2) {
                lVar46 = 0;
                for (iVar44 = 0; iVar44 + 3 < iVar28; iVar44 = iVar44 + 4) {
                  auVar7 = *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46);
                  auVar105 = *(undefined1 (*) [32])((long)(ppp_Var39 + 0xc) + lVar46);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x20);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x60);
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar46),auVar8,
                                            auVar89);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46),
                                            auVar8,auVar89);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar7);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,auVar7);
                  auVar85 = vfmadd213ps_fma(auVar7,auVar8,auVar89);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar105);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar104,auVar105);
                  auVar85 = vfmadd213ps_fma(auVar105,auVar8,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar46));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar46));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x14) + lVar46));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x80);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xa0);
                  auVar10 = *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46);
                  auVar11 = *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46);
                  auVar12 = *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar46);
                  auVar13 = *(undefined1 (*) [32])((long)(ppp_Var42 + 0x10) + lVar46);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar9,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar46));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar46),auVar8,
                                            auVar89);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar9,auVar10);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar10);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar7,auVar10);
                  auVar85 = vfmadd213ps_fma(auVar10,auVar8,auVar89);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar9,auVar11);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar11);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar7,auVar11);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar104,auVar11);
                  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,auVar11);
                  auVar85 = vfmadd213ps_fma(auVar11,auVar8,auVar89);
                  auVar80 = vfmadd213ps_fma(auVar8,auVar12,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar12);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar13,auVar88);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar9,auVar12);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,auVar12);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar7,auVar13);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar104,auVar12);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,auVar13);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar46),auVar104);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar105,auVar12);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar105,auVar13);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar105,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar46));
                  auVar8 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x20);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x40);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x60);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar9,
                                             *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar9,auVar8);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,auVar88);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,auVar9);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xc0);
                  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar9,
                                             *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar10 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x80);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar7,auVar8);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar7,auVar88);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,auVar104);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar10,auVar7);
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xe0);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar9,auVar8);
                  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar7,auVar8);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0xa0);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar105,auVar88);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar105,auVar104);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,auVar10);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,auVar105);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x100);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar9,auVar88);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar7,auVar88);
                  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar105,auVar88);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar9,auVar104);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,auVar104);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar7,auVar10);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar105,auVar104);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar105,auVar10);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar105,auVar8);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x20);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x40);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar9,
                                             *(undefined1 (*) [32])((long)pvVar47 + lVar46));
                  auVar104 = *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x60);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar9,auVar8);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,auVar88);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,auVar9);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar7,auVar8);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x80);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar7,auVar88);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,auVar104);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,auVar7);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar105,auVar88);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar105,auVar104);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,auVar8);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,
                                            *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0xa0));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46) = ZEXT1632(auVar119);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x20) = ZEXT1632(auVar135);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x40) = ZEXT1632(auVar76);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x60) = ZEXT1632(auVar90);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46) = ZEXT1632(auVar107);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46 + 0x20) = ZEXT1632(auVar117);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46 + 0x40) = ZEXT1632(auVar85);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46 + 0x60) = ZEXT1632(auVar80);
                  lVar46 = lVar46 + 0x80;
                }
                for (; iVar44 + 1 < iVar28; iVar44 = iVar44 + 2) {
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x20);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x40);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x60);
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar46),auVar7,
                                            auVar89);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46),
                                            auVar7,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 0xc) + lVar46)
                                           );
                  auVar104 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x80);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xa0);
                  auVar10 = *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46);
                  auVar11 = *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,
                                             *(undefined1 (*) [32])((long)ppp_Var42 + lVar46));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar10);
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar46),auVar7,
                                            auVar89);
                  auVar80 = vfmadd213ps_fma(auVar7,auVar10,auVar89);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar104,auVar10);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,auVar11);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,auVar10);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar11,auVar105);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar9,auVar11);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar9,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar46)
                                           );
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,auVar11);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar46)
                                           );
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xc0);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xe0);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x100);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x20);
                  auVar11 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x40);
                  auVar12 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x60);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar7,
                                             *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,auVar10);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar10,auVar88);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar105,auVar10);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar105,auVar11);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,auVar10);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar11,auVar104);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar8,auVar11);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar8,auVar12);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,auVar11);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar9,auVar12);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x20);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x40);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar47 + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,auVar7);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,auVar88);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,auVar105);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,auVar104);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x60));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46) = ZEXT1632(auVar135);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x20) = ZEXT1632(auVar76);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46) = ZEXT1632(auVar85);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46 + 0x20) = ZEXT1632(auVar80);
                  lVar46 = lVar46 + 0x40;
                }
                for (; iVar44 < iVar28; iVar44 = iVar44 + 1) {
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x20);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x40);
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar46),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58),auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46));
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x60);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46));
                  auVar88 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x80);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xa0);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar46));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var42 + lVar46),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58),auVar89);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xc0);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xe0);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x100);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x20);
                  auVar11 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x40);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,auVar10);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar10);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar9,auVar11);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,auVar11);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar47 + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x20));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,
                                            *(undefined1 (*) [32])((long)pvVar47 + lVar46 + 0x40));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46) = ZEXT1632(auVar80);
                  *(undefined1 (*) [32])((long)pvVar34 + lVar46) = ZEXT1632(auVar85);
                  lVar46 = lVar46 + 0x20;
                }
                ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar46 + lVar49);
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar46 + lVar49);
                pvVar60 = (void *)((long)pvVar60 + lVar46 + lVar49);
                pvVar47 = (void *)((long)pvVar47 + lVar46 + lVar49);
                pvVar56 = (void *)((long)pvVar56 + lVar46 + lVar33);
                pvVar34 = (void *)((long)pvVar34 + lVar46 + lVar33);
              }
              for (; (int)uVar40 < iVar41; uVar40 = uVar40 + 1) {
                lVar46 = 0;
                for (iVar44 = 0; iVar44 + 3 < iVar28; iVar44 = iVar44 + 4) {
                  auVar7 = *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46);
                  auVar105 = *(undefined1 (*) [32])((long)(ppp_Var39 + 0xc) + lVar46);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x20);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x60);
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar46),auVar8,
                                            auVar89);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46),
                                            auVar8,auVar89);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar7);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,auVar7);
                  auVar85 = vfmadd213ps_fma(auVar7,auVar8,auVar89);
                  auVar80 = vfmadd213ps_fma(auVar8,auVar105,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,auVar105);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar46),auVar88);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar104,auVar105);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x14) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar46));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x80);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xa0);
                  auVar8 = *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46);
                  auVar88 = *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar46);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar9,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar46));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar9,
                                             *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46))
                  ;
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,auVar8);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,auVar9);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar7,auVar8);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,auVar88);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar46),auVar7);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar105,auVar8);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar105,auVar88);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar46));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xc0);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xe0);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x100);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x20);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x60);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x80);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar7,auVar88);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,auVar104);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar9,auVar7);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar105,auVar88);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar105,auVar104);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,auVar9);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar10,auVar105);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar8,auVar104);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar8,auVar9);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,auVar10);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0xa0));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46) = ZEXT1632(auVar76);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x20) = ZEXT1632(auVar135);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x40) = ZEXT1632(auVar85);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x60) = ZEXT1632(auVar80);
                  lVar46 = lVar46 + 0x80;
                }
                for (; iVar44 + 1 < iVar28; iVar44 = iVar44 + 2) {
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x20);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x40);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x60);
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar46),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58),auVar89);
                  auVar80 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar58),
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46),
                                            auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46),
                                            auVar7);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 0xc) + lVar46)
                                           );
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x80);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xa0);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46),
                                            auVar8);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46),
                                            auVar7);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar46)
                                           );
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xc0);
                  auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xe0);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x100);
                  auVar88 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x20);
                  auVar104 = *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x40);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,auVar7);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,auVar88);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,auVar105);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,auVar104);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x60));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46) = ZEXT1632(auVar85);
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46 + 0x20) = ZEXT1632(auVar80);
                  lVar46 = lVar46 + 0x40;
                }
                for (; iVar44 < iVar28; iVar44 = iVar44 + 1) {
                  auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar58),auVar89,
                                            *(undefined1 (*) [32])((long)ppp_Var39 + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x20),
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x40),
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x60),
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x80),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xa0),
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar46));
                  auVar85 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xc0),
                                            ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0xe0),
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x20));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar58 + 0x100),
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar46 + 0x40));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar46) = ZEXT1632(auVar85);
                  lVar46 = lVar46 + 0x20;
                }
                ppp_Var39 = (_func_int ***)((long)(ppp_Var39 + 8) + lVar46);
                ppp_Var42 = (_func_int ***)((long)(ppp_Var42 + 8) + lVar46);
                pvVar60 = (void *)((long)pvVar60 + lVar46 + 0x40);
                pvVar56 = (void *)((long)pvVar56 + lVar46);
              }
            }
          }
          else {
            iVar62 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var36) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var36) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var36) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var36) != 2)) goto LAB_003ab183;
            iVar28 = top_blob->w;
            lVar50 = *(long *)(&this->field_0x1b0 + (long)p_Var36);
            uVar52 = 0;
            uVar65 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar65 = uVar52;
            }
            uVar40 = local_298.c;
            if (local_298.c < 1) {
              uVar40 = 0;
            }
            lVar33 = (long)((local_298.w - iVar28) * 0x10) * 4;
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar52 != uVar40;
                uVar52 = uVar52 + 1) {
              if (lVar50 == 0) {
                auVar89 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar89 = *(undefined1 (*) [32])(lVar50 + uVar52 * 0x20);
              }
              pauVar55 = (undefined1 (*) [32])
                         (top_blob->cstep * uVar52 * top_blob->elemsize + (long)top_blob->data);
              pvVar17 = (this->weight_data_tm).data;
              lVar49 = (long)(this->weight_data_tm).w * uVar52 * (this->weight_data_tm).elemsize;
              ppp_Var39 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar52 * local_298.elemsize);
              ppp_Var42 = (_func_int ***)((long)ppp_Var39 + (long)local_298.w * local_298.elemsize);
              pvVar60 = (void *)((long)ppp_Var39 + (long)local_298.w * local_298.elemsize * 2);
              auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar49);
              auVar105 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x20);
              auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x40);
              auVar88 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x60);
              auVar104 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x80);
              auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0xa0);
              auVar10 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0xc0);
              auVar11 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0xe0);
              auVar12 = *(undefined1 (*) [32])((long)pvVar17 + lVar49 + 0x100);
              for (iVar41 = 0; iVar41 != (int)uVar65; iVar41 = iVar41 + 1) {
                lVar49 = 0;
                for (iVar44 = 0; iVar44 + 3 < iVar28; iVar44 = iVar44 + 4) {
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar49),auVar7,
                                            auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar49));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                             *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar49))
                  ;
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar49),
                                            auVar7,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 0xc) + lVar49)
                                           );
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar49));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar49),auVar7,auVar89);
                  auVar80 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x18) + lVar49),auVar7,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x14) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar105,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x1c) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x18) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x20) + lVar49));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar88,
                                             *(undefined1 (*) [32])((long)ppp_Var42 + lVar49));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar88,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar49));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar104,
                                             *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar49))
                  ;
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar9,
                                             *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar49))
                  ;
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x18) + lVar49));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar49)
                                           );
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x14) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x1c) + lVar49));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x18) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x20) + lVar49));
                  auVar13 = *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x40);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar10,
                                             *(undefined1 (*) [32])((long)pvVar60 + lVar49));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar10,auVar13);
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar11,
                                             *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x20));
                  auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar12,auVar13);
                  auVar13 = *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x80);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar10,auVar13);
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x60));
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar12,auVar13);
                  auVar13 = *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0xc0);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar10,auVar13);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0xa0));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0xe0));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar12,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x100));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar12,auVar13);
                  *pauVar55 = ZEXT1632(auVar135);
                  pauVar55[1] = ZEXT1632(auVar76);
                  pauVar55[2] = ZEXT1632(auVar85);
                  pauVar55[3] = ZEXT1632(auVar80);
                  pauVar55 = pauVar55 + 4;
                  lVar49 = lVar49 + 0x100;
                }
                for (; iVar44 + 1 < iVar28; iVar44 = iVar44 + 2) {
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar49),auVar7,
                                            auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar49));
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar49),
                                            auVar7,auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 0xc) + lVar49)
                                           );
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var39 + 0x10) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar88,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar49));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar104,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 0xc) + lVar49)
                                           );
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar9,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var42 + 0x10) + lVar49));
                  auVar13 = *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x40);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar10,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar10,auVar13);
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x20));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x60));
                  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar12,auVar13);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar12,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x80));
                  *pauVar55 = ZEXT1632(auVar80);
                  pauVar55[1] = ZEXT1632(auVar85);
                  pauVar55 = pauVar55 + 2;
                  lVar49 = lVar49 + 0x80;
                }
                for (; iVar44 < iVar28; iVar44 = iVar44 + 1) {
                  auVar85 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var39 + lVar49),auVar7,
                                            auVar89);
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 4) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var39 + 8) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar88,
                                            *(undefined1 (*) [32])((long)ppp_Var42 + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 4) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar9,
                                            *(undefined1 (*) [32])((long)(ppp_Var42 + 8) + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar10,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x20));
                  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar12,
                                            *(undefined1 (*) [32])((long)pvVar60 + lVar49 + 0x40));
                  *pauVar55 = ZEXT1632(auVar85);
                  pauVar55 = pauVar55 + 1;
                  lVar49 = lVar49 + 0x40;
                }
                ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar49 + lVar33);
                ppp_Var42 = (_func_int ***)((long)ppp_Var42 + lVar49 + lVar33);
                pvVar60 = (void *)((long)pvVar60 + lVar49 + lVar33);
              }
            }
          }
          goto LAB_003ab4e0;
        }
LAB_003ab183:
        uVar63 = iVar62 * iVar28;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar63,(allocator_type *)&opt_p);
        pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var36 = pp_Var20[-3];
        iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var36);
        iVar62 = *(int *)(&this->field_0xdc + (long)p_Var36);
        iVar14 = *(int *)(&this->field_0xd4 + (long)p_Var36);
        iVar48 = 0;
        lVar50 = 0;
        for (iVar45 = 0; iVar45 < *(int *)(&this->field_0xd8 + (long)p_Var36); iVar45 = iVar45 + 1)
        {
          for (lVar33 = 0; (int)lVar33 < *(int *)(&this->field_0xd4 + (long)p_Var36);
              lVar33 = lVar33 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar50 + lVar33] = iVar48;
            p_Var36 = pp_Var20[-3];
            iVar48 = iVar48 + *(int *)(&this->field_0xdc + (long)p_Var36);
          }
          iVar48 = iVar48 + (iVar26 * iVar28 - iVar62 * iVar14);
          lVar50 = (int)lVar50 + lVar33;
        }
        local_248._0_4_ = uVar63 * 8;
        uVar52 = 0;
        uVar65 = (ulong)uVar63;
        if ((int)uVar63 < 1) {
          uVar65 = uVar52;
        }
        uVar32 = (ulong)uVar40;
        if ((int)uVar40 < 1) {
          uVar32 = uVar52;
        }
        for (uVar37 = 0; uVar37 != uVar32; uVar37 = uVar37 + 1) {
          pvVar60 = (void *)(top_blob->cstep * uVar37 * top_blob->elemsize + (long)top_blob->data);
          pvVar17 = (this->weight_data_tm).data;
          for (iVar28 = 0; iVar28 <= local_2e8; iVar28 = iVar28 + 1) {
            pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
            for (lVar50 = 0; lVar50 <= iVar41; lVar50 = lVar50 + 1) {
              p_Var36 = pp_Var20[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var36) == 0) {
                auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar74 = ZEXT3264(*(undefined1 (*) [32])
                                    (*(long *)(&this->field_0x1b0 + (long)p_Var36) + uVar37 * 0x20))
                ;
              }
              for (lVar33 = 0; uVar65 * 4 != lVar33; lVar33 = lVar33 + 4) {
                auVar85 = vfmadd231ps_fma(auVar74._0_32_,
                                          *(undefined1 (*) [32])
                                           ((long)&((Allocator *)
                                                   ((long)local_298.data +
                                                   (long)*(int *)((long)_space_ofs.
                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar33)
                                                  * 4 * 8))->_vptr_Allocator +
                                           (long)(*(int *)(&this->field_0xe4 + (long)p_Var36) *
                                                  (int)lVar50 * 8) * 4 +
                                           (long)iVar28 *
                                           (long)*(int *)(&this->field_0xe8 + (long)p_Var36) *
                                           (long)local_298.w * local_298.elemsize +
                                           local_298.cstep * uVar37 * local_298.elemsize),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar17 + lVar33 * 8 + (long)(int)uVar52 * 4));
                auVar74 = ZEXT1664(auVar85);
              }
              *(undefined1 (*) [32])((long)pvVar60 + lVar50 * 0x20) = auVar74._0_32_;
            }
            pvVar60 = (void *)((long)pvVar60 + (long)(iVar44 * 8) * 4);
          }
          uVar52 = (ulong)(uint)((int)uVar52 + (int)local_248);
        }
        pLVar21 = this->activation;
        if (pLVar21 != (Layer *)0x0) {
          (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    iVar45 = 0;
    goto LAB_003ab48b;
  }
LAB_003a985a:
  uVar65 = (long)iVar29 / (long)iVar15;
  uVar32 = (long)iVar45 / (long)iVar15;
  if (opt->use_packing_layout == true) {
    local_308 = (uint)((uVar65 & 3) == 0) * 3 + 1;
    if ((uVar65 & 7) == 0) {
      local_308 = 8;
    }
    uVar40 = (uint)((uVar32 & 3) == 0) * 3 + 1;
    if ((uVar32 & 7) == 0) {
      uVar40 = 8;
    }
  }
  else {
    local_308 = 1;
    uVar40 = 1;
  }
  piVar19 = (int *)CONCAT44(local_298.refcount._4_4_,(int)local_298.refcount);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)CONCAT44(local_298.refcount._4_4_,(int)local_298.refcount);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_298.data;
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_298.elemsize;
  uVar68._4_4_ = local_298.w;
  uVar68._0_4_ = local_298.dims;
  uVar75._4_4_ = local_298.d;
  uVar75._0_4_ = local_298.h;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
  }
  if ((int)local_308 < iVar28) {
    opt_p.lightmode = opt->lightmode;
    opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_p.num_threads = opt->num_threads;
    opt_p.workspace_allocator = opt->workspace_allocator;
    opt_p.openmp_blocktime = opt->openmp_blocktime;
    opt_p.use_winograd_convolution = opt->use_winograd_convolution;
    opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_p.use_int8_inference = opt->use_int8_inference;
    opt_p.use_vulkan_compute = opt->use_vulkan_compute;
    opt_p.use_bf16_storage = opt->use_bf16_storage;
    opt_p.use_fp16_packed = opt->use_fp16_packed;
    opt_p.use_fp16_storage = opt->use_fp16_storage;
    opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_p.use_int8_packed = opt->use_int8_packed;
    opt_p.use_int8_storage = opt->use_int8_storage;
    opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_p.use_packing_layout = opt->use_packing_layout;
    opt_p.use_shader_pack8 = opt->use_shader_pack8;
    opt_p.use_subgroup_basic = opt->use_subgroup_basic;
    opt_p.use_subgroup_vote = opt->use_subgroup_vote;
    opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_p.use_image_storage = opt->use_image_storage;
    opt_p.use_tensor_storage = opt->use_tensor_storage;
    opt_p.use_reserved_0 = opt->use_reserved_0;
    opt_p.flush_denormals = opt->flush_denormals;
    opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_p.use_shader_local_memory = opt->use_shader_local_memory;
    opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_p.use_reserved_7 = opt->use_reserved_7;
    opt_p.use_reserved_8 = opt->use_reserved_8;
    opt_p.use_reserved_9 = opt->use_reserved_9;
    opt_p.use_reserved_10 = opt->use_reserved_10;
    opt_p.use_reserved_11 = opt->use_reserved_11;
    opt_p.blob_allocator = opt->workspace_allocator;
    convert_packing(&local_298,(Mat *)&_space_ofs,local_308,&opt_p);
  }
  piVar19 = top_blob->refcount;
  opt_p._0_8_ = top_blob->data;
  opt_p.blob_allocator = (Allocator *)top_blob->refcount;
  opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
  opt_p.openmp_blocktime = top_blob->elempack;
  opt_p._32_8_ = top_blob->allocator;
  opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
  opt_p._48_8_ = *(undefined8 *)&top_blob->h;
  opt_p._56_4_ = top_blob->c;
  sVar16 = top_blob->cstep;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
  }
  if (uVar40 < uVar51) {
    Mat::create((Mat *)&opt_p,iVar44,(int)local_248,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
                (int)uVar40,(ulong)uVar40 * (local_238 / uVar52),uVar40,opt->workspace_allocator);
    iVar45 = -100;
    if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar16 != 0)) goto LAB_003a9a7d;
  }
  else {
LAB_003a9a7d:
    iVar41 = 0;
    iVar28 = 0;
    for (lVar50 = 0;
        lVar50 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
        lVar50 = lVar50 + 1) {
      m.c = (int)uVar65 / (int)local_308;
      m.data = (void *)((long)(iVar41 / (int)local_308) * sVar18 *
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                       (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      m.refcount = (int *)0x0;
      m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      m.elempack = iVar62;
      m.allocator = pAVar25;
      m.cstep = ((long)iVar27 *
                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * (long)iVar48 * (long)iVar14 +
                 0xfU & 0xfffffffffffffff0) /
                (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      m_1.c = (int)uVar32 / (int)uVar40;
      m_1.data = (void *)((long)(iVar28 / (int)uVar40) * sVar16 * (long)opt_p.workspace_allocator +
                         opt_p._0_8_);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)opt_p.workspace_allocator;
      m_1.elempack = opt_p.openmp_blocktime;
      m_1.allocator = (Allocator *)opt_p._32_8_;
      m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                   (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_p.workspace_allocator;
      m_1._40_8_ = opt_p._40_8_;
      m_1._48_8_ = opt_p._48_8_;
      pLVar21 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar50];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
      m._40_8_ = uVar68;
      m._48_8_ = uVar75;
      (*pLVar21->_vptr_Layer[7])(pLVar21,&m,&m_1,&opt_g);
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar28 = iVar28 + (int)uVar32;
      iVar41 = iVar41 + (int)uVar65;
    }
    if (uVar40 < uVar51) {
      iVar45 = 0;
      convert_packing((Mat *)&opt_p,top_blob,uVar51,opt);
    }
    else {
      iVar45 = 0;
      if ((Mat *)&opt_p != top_blob) {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar19 = top_blob->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = (void *)opt_p._0_8_;
        top_blob->refcount = (int *)opt_p.blob_allocator;
        top_blob->elemsize = (size_t)opt_p.workspace_allocator;
        top_blob->elempack = opt_p.openmp_blocktime;
        top_blob->allocator = (Allocator *)opt_p._32_8_;
        *(undefined8 *)&top_blob->dims = opt_p._40_8_;
        *(undefined8 *)&top_blob->h = opt_p._48_8_;
        top_blob->c = opt_p._56_4_;
        top_blob->cstep = sVar16;
      }
    }
  }
  if (opt_p.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_p._32_8_ == 0) {
        free((void *)opt_p._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
      }
    }
  }
  local_248 = CONCAT44(local_248._4_4_,(int)local_248);
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    LOCK();
    *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    local_248 = CONCAT44(local_248._4_4_,(int)local_248);
    if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish == 0) {
      if (pAVar25 == (Allocator *)0x0) {
        free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      else {
        (*pAVar25->_vptr_Allocator[3])();
      }
    }
  }
LAB_003ab48b:
  piVar19 = (int *)CONCAT44(local_298.refcount._4_4_,(int)local_298.refcount);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        free(local_298.data);
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar45;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}